

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  long lVar7;
  long lVar8;
  RTCRayQueryContext *pRVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  undefined8 uVar19;
  ulong uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [12];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  byte bVar65;
  byte bVar66;
  byte bVar67;
  byte bVar68;
  long lVar69;
  ulong uVar70;
  byte bVar71;
  byte bVar72;
  int iVar73;
  long lVar74;
  bool bVar75;
  ulong uVar76;
  uint uVar77;
  uint uVar144;
  uint uVar145;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  uint uVar147;
  uint uVar148;
  uint uVar149;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  uint uVar146;
  uint uVar150;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float pp;
  float fVar151;
  float fVar168;
  float fVar169;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar174;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar185 [16];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar228;
  float fVar236;
  float fVar237;
  undefined1 auVar229 [16];
  float fVar238;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar239;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar246;
  undefined1 auVar243 [32];
  undefined1 auVar242 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [64];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [64];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar254 [64];
  float fVar255;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar262;
  undefined1 auVar258 [32];
  float fVar260;
  float fVar261;
  undefined1 auVar259 [64];
  undefined1 auVar263 [64];
  float fVar265;
  undefined1 auVar264 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [64];
  undefined1 auVar275 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  RTCFilterFunctionNArguments local_8f0;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 local_850 [16];
  undefined1 local_840 [16];
  undefined1 (*local_830) [32];
  ulong local_828;
  undefined1 local_820 [32];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  Primitive *local_690;
  ulong local_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 auStack_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_530 [16];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  RTCHitN local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar159 [32];
  
  uVar76 = (ulong)(byte)prim[1];
  lVar69 = uVar76 * 0x25;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar76 * 4 + 6);
  auVar107 = vpmovsxbd_avx2(auVar79);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar76 * 5 + 6);
  auVar104 = vpmovsxbd_avx2(auVar78);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar76 * 6 + 6);
  auVar110 = vpmovsxbd_avx2(auVar81);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar76 * 0xf + 6);
  auVar109 = vpmovsxbd_avx2(auVar82);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar108 = vpmovsxbd_avx2(auVar2);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar76 * 0x11 + 6);
  auVar105 = vpmovsxbd_avx2(auVar91);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar76 * 0x1a + 6);
  auVar106 = vpmovsxbd_avx2(auVar87);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar76 * 0x1b + 6);
  auVar99 = vpmovsxbd_avx2(auVar80);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar76 * 0x1c + 6);
  auVar100 = vpmovsxbd_avx2(auVar83);
  uVar174 = *(undefined4 *)(prim + lVar69 + 0x12);
  auVar84._4_4_ = uVar174;
  auVar84._0_4_ = uVar174;
  auVar84._8_4_ = uVar174;
  auVar84._12_4_ = uVar174;
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar78 = vsubps_avx512vl(auVar79,*(undefined1 (*) [16])(prim + lVar69 + 6));
  fVar18 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar69 + 0x16)) *
           *(float *)(prim + lVar69 + 0x1a);
  auVar111 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 7 + 6));
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0xb + 6));
  auVar113 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 9 + 6));
  auVar92 = vpbroadcastd_avx512vl();
  auVar93 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar76 * 0xd + 6));
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x12 + 6));
  auVar79 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar79 = vinsertps_avx512f(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar78 = vmulps_avx512vl(auVar84,auVar78);
  auVar79 = vmulps_avx512vl(auVar84,auVar79);
  auVar94 = vcvtdq2ps_avx512vl(auVar107);
  auVar95 = vcvtdq2ps_avx512vl(auVar104);
  auVar96 = vcvtdq2ps_avx512vl(auVar110);
  auVar97 = vcvtdq2ps_avx512vl(auVar109);
  auVar98 = vcvtdq2ps_avx512vl(auVar108);
  auVar107 = vcvtdq2ps_avx(auVar105);
  auVar110 = vcvtdq2ps_avx(auVar106);
  auVar109 = vcvtdq2ps_avx(auVar99);
  auVar108 = vcvtdq2ps_avx(auVar100);
  uVar174 = auVar79._0_4_;
  auVar115._4_4_ = uVar174;
  auVar115._0_4_ = uVar174;
  auVar115._8_4_ = uVar174;
  auVar115._12_4_ = uVar174;
  auVar115._16_4_ = uVar174;
  auVar115._20_4_ = uVar174;
  auVar115._24_4_ = uVar174;
  auVar115._28_4_ = uVar174;
  auVar99 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar100 = vpermps_avx512vl(auVar99,ZEXT1632(auVar79));
  auVar101 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar102 = vpermps_avx512vl(auVar101,ZEXT1632(auVar79));
  auVar103 = vmulps_avx512vl(auVar102,auVar96);
  auVar105._4_4_ = auVar102._4_4_ * auVar107._4_4_;
  auVar105._0_4_ = auVar102._0_4_ * auVar107._0_4_;
  auVar105._8_4_ = auVar102._8_4_ * auVar107._8_4_;
  auVar105._12_4_ = auVar102._12_4_ * auVar107._12_4_;
  auVar105._16_4_ = auVar102._16_4_ * auVar107._16_4_;
  auVar105._20_4_ = auVar102._20_4_ * auVar107._20_4_;
  auVar105._24_4_ = auVar102._24_4_ * auVar107._24_4_;
  auVar105._28_4_ = auVar104._28_4_;
  auVar106._4_4_ = auVar108._4_4_ * auVar102._4_4_;
  auVar106._0_4_ = auVar108._0_4_ * auVar102._0_4_;
  auVar106._8_4_ = auVar108._8_4_ * auVar102._8_4_;
  auVar106._12_4_ = auVar108._12_4_ * auVar102._12_4_;
  auVar106._16_4_ = auVar108._16_4_ * auVar102._16_4_;
  auVar106._20_4_ = auVar108._20_4_ * auVar102._20_4_;
  auVar106._24_4_ = auVar108._24_4_ * auVar102._24_4_;
  auVar106._28_4_ = auVar102._28_4_;
  auVar104 = vfmadd231ps_avx512vl(auVar103,auVar100,auVar95);
  auVar105 = vfmadd231ps_avx512vl(auVar105,auVar100,auVar98);
  auVar79 = vfmadd231ps_fma(auVar106,auVar109,auVar100);
  auVar104 = vfmadd231ps_avx512vl(auVar104,auVar115,auVar94);
  auVar105 = vfmadd231ps_avx512vl(auVar105,auVar115,auVar97);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar110,auVar115);
  auVar106 = vbroadcastss_avx512vl(auVar78);
  auVar99 = vpermps_avx512vl(auVar99,ZEXT1632(auVar78));
  auVar100 = vpermps_avx512vl(auVar101,ZEXT1632(auVar78));
  auVar96 = vmulps_avx512vl(auVar100,auVar96);
  auVar107 = vmulps_avx512vl(auVar100,auVar107);
  auVar108 = vmulps_avx512vl(auVar100,auVar108);
  auVar100 = vfmadd231ps_avx512vl(auVar96,auVar99,auVar95);
  auVar107 = vfmadd231ps_avx512vl(auVar107,auVar99,auVar98);
  auVar78 = vfmadd231ps_fma(auVar108,auVar99,auVar109);
  auVar109 = vfmadd231ps_avx512vl(auVar100,auVar106,auVar94);
  auVar108 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar97);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar106,auVar110);
  auVar101._8_4_ = 0x7fffffff;
  auVar101._0_8_ = 0x7fffffff7fffffff;
  auVar101._12_4_ = 0x7fffffff;
  auVar101._16_4_ = 0x7fffffff;
  auVar101._20_4_ = 0x7fffffff;
  auVar101._24_4_ = 0x7fffffff;
  auVar101._28_4_ = 0x7fffffff;
  auVar107 = vandps_avx(auVar101,auVar104);
  auVar97._8_4_ = 0x219392ef;
  auVar97._0_8_ = 0x219392ef219392ef;
  auVar97._12_4_ = 0x219392ef;
  auVar97._16_4_ = 0x219392ef;
  auVar97._20_4_ = 0x219392ef;
  auVar97._24_4_ = 0x219392ef;
  auVar97._28_4_ = 0x219392ef;
  uVar70 = vcmpps_avx512vl(auVar107,auVar97,1);
  bVar75 = (bool)((byte)uVar70 & 1);
  auVar94._0_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar104._0_4_;
  bVar75 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar104._4_4_;
  bVar75 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar104._8_4_;
  bVar75 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar104._12_4_;
  bVar75 = (bool)((byte)(uVar70 >> 4) & 1);
  auVar94._16_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar104._16_4_;
  bVar75 = (bool)((byte)(uVar70 >> 5) & 1);
  auVar94._20_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar104._20_4_;
  bVar75 = (bool)((byte)(uVar70 >> 6) & 1);
  auVar94._24_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar104._24_4_;
  bVar75 = SUB81(uVar70 >> 7,0);
  auVar94._28_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar104._28_4_;
  auVar107 = vandps_avx(auVar101,auVar105);
  uVar70 = vcmpps_avx512vl(auVar107,auVar97,1);
  bVar75 = (bool)((byte)uVar70 & 1);
  auVar95._0_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar105._0_4_;
  bVar75 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar105._4_4_;
  bVar75 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar105._8_4_;
  bVar75 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar105._12_4_;
  bVar75 = (bool)((byte)(uVar70 >> 4) & 1);
  auVar95._16_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar105._16_4_;
  bVar75 = (bool)((byte)(uVar70 >> 5) & 1);
  auVar95._20_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar105._20_4_;
  bVar75 = (bool)((byte)(uVar70 >> 6) & 1);
  auVar95._24_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar105._24_4_;
  bVar75 = SUB81(uVar70 >> 7,0);
  auVar95._28_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar105._28_4_;
  auVar107 = vandps_avx(auVar101,ZEXT1632(auVar79));
  uVar70 = vcmpps_avx512vl(auVar107,auVar97,1);
  bVar75 = (bool)((byte)uVar70 & 1);
  auVar107._0_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar79._0_4_;
  bVar75 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar107._4_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar79._4_4_;
  bVar75 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar107._8_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar79._8_4_;
  bVar75 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar107._12_4_ = (uint)bVar75 * 0x219392ef | (uint)!bVar75 * auVar79._12_4_;
  auVar107._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * 0x219392ef;
  auVar107._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * 0x219392ef;
  auVar107._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * 0x219392ef;
  auVar107._28_4_ = (uint)(byte)(uVar70 >> 7) * 0x219392ef;
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = 0x3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar98._16_4_ = 0x3f800000;
  auVar98._20_4_ = 0x3f800000;
  auVar98._24_4_ = 0x3f800000;
  auVar98._28_4_ = 0x3f800000;
  auVar110 = vrcp14ps_avx512vl(auVar94);
  auVar79 = vfnmadd213ps_fma(auVar94,auVar110,auVar98);
  auVar79 = vfmadd132ps_fma(ZEXT1632(auVar79),auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar95);
  auVar78 = vfnmadd213ps_fma(auVar95,auVar110,auVar98);
  auVar78 = vfmadd132ps_fma(ZEXT1632(auVar78),auVar110,auVar110);
  auVar110 = vrcp14ps_avx512vl(auVar107);
  auVar81 = vfnmadd213ps_fma(auVar107,auVar110,auVar98);
  auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar110,auVar110);
  auVar96._4_4_ = fVar18;
  auVar96._0_4_ = fVar18;
  auVar96._8_4_ = fVar18;
  auVar96._12_4_ = fVar18;
  auVar96._16_4_ = fVar18;
  auVar96._20_4_ = fVar18;
  auVar96._24_4_ = fVar18;
  auVar96._28_4_ = fVar18;
  auVar107 = vcvtdq2ps_avx(auVar111);
  auVar110 = vcvtdq2ps_avx(auVar112);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar82 = vfmadd213ps_fma(auVar110,auVar96,auVar107);
  auVar107 = vcvtdq2ps_avx(auVar113);
  auVar110 = vcvtdq2ps_avx512vl(auVar93);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar2 = vfmadd213ps_fma(auVar110,auVar96,auVar107);
  auVar107 = vcvtdq2ps_avx(auVar114);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x16 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar91 = vfmadd213ps_fma(auVar110,auVar96,auVar107);
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x14 + 6));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x18 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar87 = vfmadd213ps_fma(auVar110,auVar96,auVar107);
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x1d + 6));
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x21 + 6));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar80 = vfmadd213ps_fma(auVar110,auVar96,auVar107);
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x1f + 6));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar110 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x23 + 6));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar110 = vsubps_avx(auVar110,auVar107);
  auVar83 = vfmadd213ps_fma(auVar110,auVar96,auVar107);
  auVar107 = vsubps_avx512vl(ZEXT1632(auVar82),auVar109);
  auVar99._4_4_ = auVar79._4_4_ * auVar107._4_4_;
  auVar99._0_4_ = auVar79._0_4_ * auVar107._0_4_;
  auVar99._8_4_ = auVar79._8_4_ * auVar107._8_4_;
  auVar99._12_4_ = auVar79._12_4_ * auVar107._12_4_;
  auVar99._16_4_ = auVar107._16_4_ * 0.0;
  auVar99._20_4_ = auVar107._20_4_ * 0.0;
  auVar99._24_4_ = auVar107._24_4_ * 0.0;
  auVar99._28_4_ = auVar107._28_4_;
  auVar107 = vsubps_avx512vl(ZEXT1632(auVar2),auVar109);
  auVar114._0_4_ = auVar79._0_4_ * auVar107._0_4_;
  auVar114._4_4_ = auVar79._4_4_ * auVar107._4_4_;
  auVar114._8_4_ = auVar79._8_4_ * auVar107._8_4_;
  auVar114._12_4_ = auVar79._12_4_ * auVar107._12_4_;
  auVar114._16_4_ = auVar107._16_4_ * 0.0;
  auVar114._20_4_ = auVar107._20_4_ * 0.0;
  auVar114._24_4_ = auVar107._24_4_ * 0.0;
  auVar114._28_4_ = 0;
  auVar107 = vsubps_avx(ZEXT1632(auVar91),auVar108);
  auVar100._4_4_ = auVar78._4_4_ * auVar107._4_4_;
  auVar100._0_4_ = auVar78._0_4_ * auVar107._0_4_;
  auVar100._8_4_ = auVar78._8_4_ * auVar107._8_4_;
  auVar100._12_4_ = auVar78._12_4_ * auVar107._12_4_;
  auVar100._16_4_ = auVar107._16_4_ * 0.0;
  auVar100._20_4_ = auVar107._20_4_ * 0.0;
  auVar100._24_4_ = auVar107._24_4_ * 0.0;
  auVar100._28_4_ = auVar107._28_4_;
  auVar107 = vsubps_avx(ZEXT1632(auVar87),auVar108);
  auVar113._0_4_ = auVar78._0_4_ * auVar107._0_4_;
  auVar113._4_4_ = auVar78._4_4_ * auVar107._4_4_;
  auVar113._8_4_ = auVar78._8_4_ * auVar107._8_4_;
  auVar113._12_4_ = auVar78._12_4_ * auVar107._12_4_;
  auVar113._16_4_ = auVar107._16_4_ * 0.0;
  auVar113._20_4_ = auVar107._20_4_ * 0.0;
  auVar113._24_4_ = auVar107._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar107 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar84));
  auVar111._4_4_ = auVar81._4_4_ * auVar107._4_4_;
  auVar111._0_4_ = auVar81._0_4_ * auVar107._0_4_;
  auVar111._8_4_ = auVar81._8_4_ * auVar107._8_4_;
  auVar111._12_4_ = auVar81._12_4_ * auVar107._12_4_;
  auVar111._16_4_ = auVar107._16_4_ * 0.0;
  auVar111._20_4_ = auVar107._20_4_ * 0.0;
  auVar111._24_4_ = auVar107._24_4_ * 0.0;
  auVar111._28_4_ = auVar107._28_4_;
  auVar107 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar84));
  auVar112._0_4_ = auVar81._0_4_ * auVar107._0_4_;
  auVar112._4_4_ = auVar81._4_4_ * auVar107._4_4_;
  auVar112._8_4_ = auVar81._8_4_ * auVar107._8_4_;
  auVar112._12_4_ = auVar81._12_4_ * auVar107._12_4_;
  auVar112._16_4_ = auVar107._16_4_ * 0.0;
  auVar112._20_4_ = auVar107._20_4_ * 0.0;
  auVar112._24_4_ = auVar107._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar107 = vpminsd_avx2(auVar99,auVar114);
  auVar110 = vpminsd_avx2(auVar100,auVar113);
  auVar107 = vmaxps_avx(auVar107,auVar110);
  auVar110 = vpminsd_avx2(auVar111,auVar112);
  uVar174 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar109._4_4_ = uVar174;
  auVar109._0_4_ = uVar174;
  auVar109._8_4_ = uVar174;
  auVar109._12_4_ = uVar174;
  auVar109._16_4_ = uVar174;
  auVar109._20_4_ = uVar174;
  auVar109._24_4_ = uVar174;
  auVar109._28_4_ = uVar174;
  auVar110 = vmaxps_avx512vl(auVar110,auVar109);
  auVar107 = vmaxps_avx(auVar107,auVar110);
  auVar110._8_4_ = 0x3f7ffffa;
  auVar110._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar110._12_4_ = 0x3f7ffffa;
  auVar110._16_4_ = 0x3f7ffffa;
  auVar110._20_4_ = 0x3f7ffffa;
  auVar110._24_4_ = 0x3f7ffffa;
  auVar110._28_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar107,auVar110);
  auVar107 = vpmaxsd_avx2(auVar99,auVar114);
  auVar110 = vpmaxsd_avx2(auVar100,auVar113);
  auVar249 = ZEXT3264(auVar101);
  auVar107 = vminps_avx(auVar107,auVar110);
  auVar110 = vpmaxsd_avx2(auVar111,auVar112);
  uVar174 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar108._4_4_ = uVar174;
  auVar108._0_4_ = uVar174;
  auVar108._8_4_ = uVar174;
  auVar108._12_4_ = uVar174;
  auVar108._16_4_ = uVar174;
  auVar108._20_4_ = uVar174;
  auVar108._24_4_ = uVar174;
  auVar108._28_4_ = uVar174;
  auVar110 = vminps_avx512vl(auVar110,auVar108);
  auVar107 = vminps_avx(auVar107,auVar110);
  auVar104._8_4_ = 0x3f800003;
  auVar104._0_8_ = 0x3f8000033f800003;
  auVar104._12_4_ = 0x3f800003;
  auVar104._16_4_ = 0x3f800003;
  auVar104._20_4_ = 0x3f800003;
  auVar104._24_4_ = 0x3f800003;
  auVar104._28_4_ = 0x3f800003;
  auVar107 = vmulps_avx512vl(auVar107,auVar104);
  uVar19 = vcmpps_avx512vl(local_300,auVar107,2);
  uVar22 = vpcmpgtd_avx512vl(auVar92,_DAT_01fb4ba0);
  local_688 = (ulong)(byte)((byte)uVar19 & (byte)uVar22);
  local_830 = (undefined1 (*) [32])&local_3a0;
  local_520 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_690 = prim;
LAB_01b2b9a1:
  if (local_688 == 0) {
    return;
  }
  lVar69 = 0;
  for (uVar70 = local_688; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
    lVar69 = lVar69 + 1;
  }
  uVar3 = *(uint *)(local_690 + 2);
  local_828 = (ulong)*(uint *)(local_690 + lVar69 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar3].ptr;
  uVar70 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           local_828 *
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar18 = (pGVar5->time_range).lower;
  fVar18 = pGVar5->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar18) / ((pGVar5->time_range).upper - fVar18));
  auVar79 = vroundss_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18),9);
  auVar79 = vminss_avx(auVar79,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
  auVar79 = vmaxss_avx(ZEXT816(0) << 0x20,auVar79);
  fVar18 = fVar18 - auVar79._0_4_;
  _Var6 = pGVar5[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar74 = (long)(int)auVar79._0_4_ * 0x38;
  lVar69 = *(long *)(_Var6 + 0x10 + lVar74);
  lVar7 = *(long *)(_Var6 + 0x38 + lVar74);
  lVar8 = *(long *)(_Var6 + 0x48 + lVar74);
  pfVar1 = (float *)(lVar7 + uVar70 * lVar8);
  auVar86._0_4_ = fVar18 * *pfVar1;
  auVar86._4_4_ = fVar18 * pfVar1[1];
  auVar86._8_4_ = fVar18 * pfVar1[2];
  auVar86._12_4_ = fVar18 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar70 + 1) * lVar8);
  auVar90._0_4_ = fVar18 * *pfVar1;
  auVar90._4_4_ = fVar18 * pfVar1[1];
  auVar90._8_4_ = fVar18 * pfVar1[2];
  auVar90._12_4_ = fVar18 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + (uVar70 + 2) * lVar8);
  auVar229._0_4_ = fVar18 * *pfVar1;
  auVar229._4_4_ = fVar18 * pfVar1[1];
  auVar229._8_4_ = fVar18 * pfVar1[2];
  auVar229._12_4_ = fVar18 * pfVar1[3];
  pfVar1 = (float *)(lVar7 + lVar8 * (uVar70 + 3));
  auVar89._0_4_ = fVar18 * *pfVar1;
  auVar89._4_4_ = fVar18 * pfVar1[1];
  auVar89._8_4_ = fVar18 * pfVar1[2];
  auVar89._12_4_ = fVar18 * pfVar1[3];
  lVar7 = *(long *)(_Var6 + lVar74);
  fVar18 = 1.0 - fVar18;
  auVar88._4_4_ = fVar18;
  auVar88._0_4_ = fVar18;
  auVar88._8_4_ = fVar18;
  auVar88._12_4_ = fVar18;
  auVar81 = vfmadd231ps_fma(auVar86,auVar88,*(undefined1 (*) [16])(lVar7 + lVar69 * uVar70));
  auVar82 = vfmadd231ps_fma(auVar90,auVar88,*(undefined1 (*) [16])(lVar7 + lVar69 * (uVar70 + 1)));
  auVar2 = vfmadd231ps_fma(auVar229,auVar88,*(undefined1 (*) [16])(lVar7 + lVar69 * (uVar70 + 2)));
  auVar91 = vfmadd231ps_fma(auVar89,auVar88,*(undefined1 (*) [16])(lVar7 + lVar69 * (uVar70 + 3)));
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar78 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar174 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar272._4_4_ = uVar174;
  auVar272._0_4_ = uVar174;
  auVar272._8_4_ = uVar174;
  auVar272._12_4_ = uVar174;
  local_5c0._16_4_ = uVar174;
  local_5c0._0_16_ = auVar272;
  local_5c0._20_4_ = uVar174;
  local_5c0._24_4_ = uVar174;
  local_5c0._28_4_ = uVar174;
  uVar174 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar273._4_4_ = uVar174;
  auVar273._0_4_ = uVar174;
  auVar273._8_4_ = uVar174;
  auVar273._12_4_ = uVar174;
  local_4a0._16_4_ = uVar174;
  local_4a0._0_16_ = auVar273;
  local_4a0._20_4_ = uVar174;
  local_4a0._24_4_ = uVar174;
  local_4a0._28_4_ = uVar174;
  auVar79 = vunpcklps_avx(auVar272,auVar273);
  local_5e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar84 = local_5e0._0_16_;
  local_7f0 = vinsertps_avx512f(auVar79,auVar84,0x28);
  auVar264 = ZEXT1664(local_7f0);
  auVar240._0_4_ = auVar81._0_4_ + auVar82._0_4_ + auVar2._0_4_ + auVar91._0_4_;
  auVar240._4_4_ = auVar81._4_4_ + auVar82._4_4_ + auVar2._4_4_ + auVar91._4_4_;
  auVar240._8_4_ = auVar81._8_4_ + auVar82._8_4_ + auVar2._8_4_ + auVar91._8_4_;
  auVar240._12_4_ = auVar81._12_4_ + auVar82._12_4_ + auVar2._12_4_ + auVar91._12_4_;
  auVar85._8_4_ = 0x3e800000;
  auVar85._0_8_ = 0x3e8000003e800000;
  auVar85._12_4_ = 0x3e800000;
  auVar79 = vmulps_avx512vl(auVar240,auVar85);
  auVar79 = vsubps_avx(auVar79,auVar78);
  auVar79 = vdpps_avx(auVar79,local_7f0,0x7f);
  local_800 = vdpps_avx(local_7f0,local_7f0,0x7f);
  auVar266 = ZEXT1664(local_800);
  fVar18 = *(float *)(ray + k * 4 + 0x60);
  auVar271 = ZEXT464((uint)fVar18);
  auVar259 = ZEXT3264(auVar249._0_32_);
  auVar83 = ZEXT816(0) << 0x40;
  auVar263 = ZEXT1664(auVar83);
  auVar247._4_12_ = ZEXT812(0) << 0x20;
  auVar247._0_4_ = local_800._0_4_;
  auVar80 = vrcp14ss_avx512f(auVar83,auVar247);
  auVar87 = vfnmadd213ss_fma(auVar80,local_800,ZEXT416(0x40000000));
  local_2e0 = auVar79._0_4_ * auVar80._0_4_ * auVar87._0_4_;
  auVar245 = ZEXT464((uint)local_2e0);
  auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar275 = ZEXT3264(auVar107);
  auVar248._4_4_ = local_2e0;
  auVar248._0_4_ = local_2e0;
  auVar248._8_4_ = local_2e0;
  auVar248._12_4_ = local_2e0;
  fStack_750 = local_2e0;
  _local_760 = auVar248;
  fStack_74c = local_2e0;
  fStack_748 = local_2e0;
  fStack_744 = local_2e0;
  auVar79 = vfmadd231ps_fma(auVar78,local_7f0,auVar248);
  auVar79 = vblendps_avx(auVar79,auVar83,8);
  auVar78 = vsubps_avx(auVar81,auVar79);
  auVar81 = vsubps_avx(auVar2,auVar79);
  auVar82 = vsubps_avx(auVar82,auVar79);
  auVar79 = vsubps_avx(auVar91,auVar79);
  auVar254 = ZEXT1664(auVar79);
  auVar107 = vbroadcastss_avx512vl(auVar78);
  auVar92._8_4_ = 1;
  auVar92._0_8_ = 0x100000001;
  auVar92._12_4_ = 1;
  auVar92._16_4_ = 1;
  auVar92._20_4_ = 1;
  auVar92._24_4_ = 1;
  auVar92._28_4_ = 1;
  local_780 = ZEXT1632(auVar78);
  auVar110 = vpermps_avx512vl(auVar92,local_780);
  auVar274 = ZEXT3264(auVar110);
  auVar93._8_4_ = 2;
  auVar93._0_8_ = 0x200000002;
  auVar93._12_4_ = 2;
  auVar93._16_4_ = 2;
  auVar93._20_4_ = 2;
  auVar93._24_4_ = 2;
  auVar93._28_4_ = 2;
  auVar109 = vpermps_avx512vl(auVar93,local_780);
  auVar102._8_4_ = 3;
  auVar102._0_8_ = 0x300000003;
  auVar102._12_4_ = 3;
  auVar102._16_4_ = 3;
  auVar102._20_4_ = 3;
  auVar102._24_4_ = 3;
  auVar102._28_4_ = 3;
  auVar108 = vpermps_avx512vl(auVar102,local_780);
  auVar104 = vbroadcastss_avx512vl(auVar82);
  local_7c0 = ZEXT1632(auVar82);
  auVar105 = vpermps_avx512vl(auVar92,local_7c0);
  auVar106 = vpermps_avx512vl(auVar93,local_7c0);
  auVar99 = vpermps_avx512vl(auVar102,local_7c0);
  auVar100 = vbroadcastss_avx512vl(auVar81);
  local_7a0 = ZEXT1632(auVar81);
  auVar111 = vpermps_avx512vl(auVar92,local_7a0);
  auVar112 = vpermps_avx512vl(auVar93,local_7a0);
  auVar113 = vpermps_avx512vl(auVar102,local_7a0);
  local_260 = vbroadcastss_avx512vl(auVar79);
  _local_7e0 = ZEXT1632(auVar79);
  local_280 = vpermps_avx2(auVar92,_local_7e0);
  local_2a0 = vpermps_avx512vl(auVar93,_local_7e0);
  local_2c0 = vpermps_avx2(auVar102,_local_7e0);
  auVar79 = vmulss_avx512f(auVar84,auVar84);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),local_4a0,local_4a0);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),local_5c0,local_5c0);
  local_220._0_4_ = auVar79._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  local_240 = vandps_avx(auVar249._0_32_,local_220);
  local_6f0 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar18 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_4c0 = vpbroadcastd_avx512vl();
  uVar70 = 0;
  iVar73 = 1;
  local_4e0 = vpbroadcastd_avx512vl();
  auVar79 = vsqrtss_avx(local_800,local_800);
  auVar78 = vsqrtss_avx(local_800,local_800);
  local_530 = ZEXT816(0x3f80000000000000);
  do {
    auVar81 = vmovshdup_avx(local_530);
    auVar81 = vsubps_avx(auVar81,local_530);
    auVar152._0_4_ = auVar81._0_4_;
    fVar238 = auVar152._0_4_ * 0.04761905;
    uVar174 = local_530._0_4_;
    local_880._4_4_ = uVar174;
    local_880._0_4_ = uVar174;
    local_880._8_4_ = uVar174;
    local_880._12_4_ = uVar174;
    local_880._16_4_ = uVar174;
    local_880._20_4_ = uVar174;
    local_880._24_4_ = uVar174;
    local_880._28_4_ = uVar174;
    auVar152._4_4_ = auVar152._0_4_;
    auVar152._8_4_ = auVar152._0_4_;
    auVar152._12_4_ = auVar152._0_4_;
    auVar159._16_4_ = auVar152._0_4_;
    auVar159._0_16_ = auVar152;
    auVar159._20_4_ = auVar152._0_4_;
    auVar159._24_4_ = auVar152._0_4_;
    auVar159._28_4_ = auVar152._0_4_;
    auVar81 = vfmadd231ps_fma(local_880,auVar159,_DAT_01f7b040);
    auVar92 = vsubps_avx512vl(auVar275._0_32_,ZEXT1632(auVar81));
    fVar255 = auVar92._0_4_;
    fVar261 = auVar92._4_4_;
    fVar225 = auVar92._8_4_;
    fVar227 = auVar92._12_4_;
    fVar228 = auVar92._16_4_;
    fVar236 = auVar92._20_4_;
    fVar237 = auVar92._24_4_;
    fVar151 = fVar255 * fVar255 * fVar255;
    fVar168 = fVar261 * fVar261 * fVar261;
    auVar116._4_4_ = fVar168;
    auVar116._0_4_ = fVar151;
    fVar169 = fVar225 * fVar225 * fVar225;
    auVar116._8_4_ = fVar169;
    fVar170 = fVar227 * fVar227 * fVar227;
    auVar116._12_4_ = fVar170;
    fVar171 = fVar228 * fVar228 * fVar228;
    auVar116._16_4_ = fVar171;
    fVar172 = fVar236 * fVar236 * fVar236;
    auVar116._20_4_ = fVar172;
    fVar173 = fVar237 * fVar237 * fVar237;
    auVar116._24_4_ = fVar173;
    auVar116._28_4_ = auVar152._0_4_;
    auVar114 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar93 = vmulps_avx512vl(auVar116,auVar114);
    fVar260 = auVar81._0_4_;
    fVar262 = auVar81._4_4_;
    fVar226 = auVar81._8_4_;
    fVar239 = auVar81._12_4_;
    fVar190 = fVar260 * fVar260 * fVar260;
    fVar205 = fVar262 * fVar262 * fVar262;
    fVar206 = fVar226 * fVar226 * fVar226;
    fVar207 = fVar239 * fVar239 * fVar239;
    auVar64._28_4_ = DAT_01f7b040._28_4_;
    auVar64._0_28_ = ZEXT1628(CONCAT412(fVar207,CONCAT48(fVar206,CONCAT44(fVar205,fVar190))));
    auVar249._0_4_ = fVar260 * fVar255;
    auVar249._4_4_ = fVar262 * fVar261;
    auVar249._8_4_ = fVar226 * fVar225;
    auVar249._12_4_ = fVar239 * fVar227;
    auVar249._16_4_ = fVar228 * 0.0;
    auVar249._20_4_ = fVar236 * 0.0;
    auVar249._28_36_ = auVar263._28_36_;
    auVar249._24_4_ = fVar237 * 0.0;
    auVar94 = vmulps_avx512vl(auVar64,auVar114);
    fVar265 = auVar94._28_4_ + auVar152._0_4_;
    fVar246 = fVar265 + auVar266._28_4_ + auVar245._28_4_;
    auVar117._4_4_ = fVar168 * 0.16666667;
    auVar117._0_4_ = fVar151 * 0.16666667;
    auVar117._8_4_ = fVar169 * 0.16666667;
    auVar117._12_4_ = fVar170 * 0.16666667;
    auVar117._16_4_ = fVar171 * 0.16666667;
    auVar117._20_4_ = fVar172 * 0.16666667;
    auVar117._24_4_ = fVar173 * 0.16666667;
    auVar117._28_4_ = fVar265;
    auVar118._4_4_ =
         (auVar249._4_4_ * fVar261 * 12.0 + auVar249._4_4_ * fVar262 * 6.0 + fVar205 + auVar93._4_4_
         ) * 0.16666667;
    auVar118._0_4_ =
         (auVar249._0_4_ * fVar255 * 12.0 + auVar249._0_4_ * fVar260 * 6.0 + fVar190 + auVar93._0_4_
         ) * 0.16666667;
    auVar118._8_4_ =
         (auVar249._8_4_ * fVar225 * 12.0 + auVar249._8_4_ * fVar226 * 6.0 + fVar206 + auVar93._8_4_
         ) * 0.16666667;
    auVar118._12_4_ =
         (auVar249._12_4_ * fVar227 * 12.0 + auVar249._12_4_ * fVar239 * 6.0 +
         fVar207 + auVar93._12_4_) * 0.16666667;
    auVar118._16_4_ =
         (auVar249._16_4_ * fVar228 * 12.0 + auVar249._16_4_ * 0.0 * 6.0 + auVar93._16_4_ + 0.0) *
         0.16666667;
    auVar118._20_4_ =
         (auVar249._20_4_ * fVar236 * 12.0 + auVar249._20_4_ * 0.0 * 6.0 + auVar93._20_4_ + 0.0) *
         0.16666667;
    auVar118._24_4_ =
         (auVar249._24_4_ * fVar237 * 12.0 + auVar249._24_4_ * 0.0 * 6.0 + auVar93._24_4_ + 0.0) *
         0.16666667;
    auVar118._28_4_ = auVar266._28_4_;
    auVar119._4_4_ =
         (auVar94._4_4_ + fVar168 + auVar249._4_4_ * fVar262 * 12.0 + auVar249._4_4_ * fVar261 * 6.0
         ) * 0.16666667;
    auVar119._0_4_ =
         (auVar94._0_4_ + fVar151 + auVar249._0_4_ * fVar260 * 12.0 + auVar249._0_4_ * fVar255 * 6.0
         ) * 0.16666667;
    auVar119._8_4_ =
         (auVar94._8_4_ + fVar169 + auVar249._8_4_ * fVar226 * 12.0 + auVar249._8_4_ * fVar225 * 6.0
         ) * 0.16666667;
    auVar119._12_4_ =
         (auVar94._12_4_ + fVar170 +
         auVar249._12_4_ * fVar239 * 12.0 + auVar249._12_4_ * fVar227 * 6.0) * 0.16666667;
    auVar119._16_4_ =
         (auVar94._16_4_ + fVar171 + auVar249._16_4_ * 0.0 * 12.0 + auVar249._16_4_ * fVar228 * 6.0)
         * 0.16666667;
    auVar119._20_4_ =
         (auVar94._20_4_ + fVar172 + auVar249._20_4_ * 0.0 * 12.0 + auVar249._20_4_ * fVar236 * 6.0)
         * 0.16666667;
    auVar119._24_4_ =
         (auVar94._24_4_ + fVar173 + auVar249._24_4_ * 0.0 * 12.0 + auVar249._24_4_ * fVar237 * 6.0)
         * 0.16666667;
    auVar119._28_4_ = auVar271._28_4_;
    fVar190 = fVar190 * 0.16666667;
    fVar205 = fVar205 * 0.16666667;
    fVar206 = fVar206 * 0.16666667;
    fVar207 = fVar207 * 0.16666667;
    auVar120._28_4_ = fVar246;
    auVar120._0_28_ = ZEXT1628(CONCAT412(fVar207,CONCAT48(fVar206,CONCAT44(fVar205,fVar190))));
    auVar94 = vmulps_avx512vl(local_260,auVar120);
    auVar125._4_4_ = local_280._4_4_ * fVar205;
    auVar125._0_4_ = local_280._0_4_ * fVar190;
    auVar125._8_4_ = local_280._8_4_ * fVar206;
    auVar125._12_4_ = local_280._12_4_ * fVar207;
    auVar125._16_4_ = local_280._16_4_ * 0.0;
    auVar125._20_4_ = local_280._20_4_ * 0.0;
    auVar125._24_4_ = local_280._24_4_ * 0.0;
    auVar125._28_4_ = auVar264._28_4_ + auVar271._28_4_ + DAT_01f7b040._28_4_ + auVar93._28_4_;
    auVar93 = vmulps_avx512vl(local_2a0,auVar120);
    auVar126._4_4_ = local_2c0._4_4_ * fVar205;
    auVar126._0_4_ = local_2c0._0_4_ * fVar190;
    auVar126._8_4_ = local_2c0._8_4_ * fVar206;
    auVar126._12_4_ = local_2c0._12_4_ * fVar207;
    auVar126._16_4_ = local_2c0._16_4_ * 0.0;
    auVar126._20_4_ = local_2c0._20_4_ * 0.0;
    auVar126._24_4_ = local_2c0._24_4_ * 0.0;
    auVar126._28_4_ = fVar246;
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar119,auVar100);
    auVar95 = vfmadd231ps_avx512vl(auVar125,auVar119,auVar111);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar119,auVar112);
    auVar96 = vfmadd231ps_avx512vl(auVar126,auVar113,auVar119);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar118,auVar104);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar118,auVar105);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar118,auVar106);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,auVar118);
    auVar97 = vfmadd231ps_avx512vl(auVar94,auVar117,auVar107);
    auVar98 = vfmadd231ps_avx512vl(auVar95,auVar117,auVar274._0_32_);
    auVar101 = vfmadd231ps_avx512vl(auVar93,auVar117,auVar109);
    auVar93 = vfmadd231ps_avx512vl(auVar96,auVar108,auVar117);
    auVar102 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar94 = vxorps_avx512vl(auVar92,auVar102);
    auVar95 = vxorps_avx512vl(ZEXT1632(auVar81),auVar102);
    auVar232._0_4_ = auVar95._0_4_ * fVar260;
    auVar232._4_4_ = auVar95._4_4_ * fVar262;
    auVar232._8_4_ = auVar95._8_4_ * fVar226;
    auVar232._12_4_ = auVar95._12_4_ * fVar239;
    auVar232._16_4_ = auVar95._16_4_ * 0.0;
    auVar232._20_4_ = auVar95._20_4_ * 0.0;
    auVar232._24_4_ = auVar95._24_4_ * 0.0;
    auVar232._28_4_ = 0;
    auVar96 = vmulps_avx512vl(auVar249._0_32_,auVar114);
    auVar114 = vsubps_avx(auVar232,auVar96);
    auVar127._4_4_ = auVar94._4_4_ * fVar261 * 0.5;
    auVar127._0_4_ = auVar94._0_4_ * fVar255 * 0.5;
    auVar127._8_4_ = auVar94._8_4_ * fVar225 * 0.5;
    auVar127._12_4_ = auVar94._12_4_ * fVar227 * 0.5;
    auVar127._16_4_ = auVar94._16_4_ * fVar228 * 0.5;
    auVar127._20_4_ = auVar94._20_4_ * fVar236 * 0.5;
    auVar127._24_4_ = auVar94._24_4_ * fVar237 * 0.5;
    auVar127._28_4_ = auVar92._28_4_;
    auVar128._4_4_ = auVar114._4_4_ * 0.5;
    auVar128._0_4_ = auVar114._0_4_ * 0.5;
    auVar128._8_4_ = auVar114._8_4_ * 0.5;
    auVar128._12_4_ = auVar114._12_4_ * 0.5;
    auVar128._16_4_ = auVar114._16_4_ * 0.5;
    auVar128._20_4_ = auVar114._20_4_ * 0.5;
    auVar128._24_4_ = auVar114._24_4_ * 0.5;
    auVar128._28_4_ = auVar114._28_4_;
    auVar129._4_4_ = (auVar96._4_4_ + fVar261 * fVar261) * 0.5;
    auVar129._0_4_ = (auVar96._0_4_ + fVar255 * fVar255) * 0.5;
    auVar129._8_4_ = (auVar96._8_4_ + fVar225 * fVar225) * 0.5;
    auVar129._12_4_ = (auVar96._12_4_ + fVar227 * fVar227) * 0.5;
    auVar129._16_4_ = (auVar96._16_4_ + fVar228 * fVar228) * 0.5;
    auVar129._20_4_ = (auVar96._20_4_ + fVar236 * fVar236) * 0.5;
    auVar129._24_4_ = (auVar96._24_4_ + fVar237 * fVar237) * 0.5;
    auVar129._28_4_ = auVar96._28_4_ + auVar254._28_4_;
    fVar255 = fVar260 * fVar260 * 0.5;
    fVar260 = fVar262 * fVar262 * 0.5;
    fVar261 = fVar226 * fVar226 * 0.5;
    fVar262 = fVar239 * fVar239 * 0.5;
    auVar130._28_4_ = auVar259._28_4_;
    auVar130._0_28_ = ZEXT1628(CONCAT412(fVar262,CONCAT48(fVar261,CONCAT44(fVar260,fVar255))));
    auVar114 = vmulps_avx512vl(local_260,auVar130);
    auVar133._4_4_ = local_280._4_4_ * fVar260;
    auVar133._0_4_ = local_280._0_4_ * fVar255;
    auVar133._8_4_ = local_280._8_4_ * fVar261;
    auVar133._12_4_ = local_280._12_4_ * fVar262;
    auVar133._16_4_ = local_280._16_4_ * 0.0;
    auVar133._20_4_ = local_280._20_4_ * 0.0;
    auVar133._24_4_ = local_280._24_4_ * 0.0;
    auVar133._28_4_ = auVar95._28_4_;
    auVar92 = vmulps_avx512vl(local_2a0,auVar130);
    auVar134._4_4_ = fVar260 * local_2c0._4_4_;
    auVar134._0_4_ = fVar255 * local_2c0._0_4_;
    auVar134._8_4_ = fVar261 * local_2c0._8_4_;
    auVar134._12_4_ = fVar262 * local_2c0._12_4_;
    auVar134._16_4_ = local_2c0._16_4_ * 0.0;
    auVar134._20_4_ = local_2c0._20_4_ * 0.0;
    auVar134._24_4_ = local_2c0._24_4_ * 0.0;
    auVar134._28_4_ = auVar259._28_4_;
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar129,auVar100);
    auVar94 = vfmadd231ps_avx512vl(auVar133,auVar129,auVar111);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar129,auVar112);
    auVar81 = vfmadd231ps_fma(auVar134,auVar113,auVar129);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar128,auVar104);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar128,auVar105);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar128,auVar106);
    auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar99,auVar128);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar127,auVar107);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar127,auVar274._0_32_);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar127,auVar109);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar108,auVar127);
    auVar37._4_4_ = auVar114._4_4_ * fVar238;
    auVar37._0_4_ = auVar114._0_4_ * fVar238;
    auVar37._8_4_ = auVar114._8_4_ * fVar238;
    auVar37._12_4_ = auVar114._12_4_ * fVar238;
    auVar37._16_4_ = auVar114._16_4_ * fVar238;
    auVar37._20_4_ = auVar114._20_4_ * fVar238;
    auVar37._24_4_ = auVar114._24_4_ * fVar238;
    auVar37._28_4_ = auVar113._28_4_;
    auVar271 = ZEXT3264(auVar37);
    auVar38._4_4_ = auVar94._4_4_ * fVar238;
    auVar38._0_4_ = auVar94._0_4_ * fVar238;
    auVar38._8_4_ = auVar94._8_4_ * fVar238;
    auVar38._12_4_ = auVar94._12_4_ * fVar238;
    auVar38._16_4_ = auVar94._16_4_ * fVar238;
    auVar38._20_4_ = auVar94._20_4_ * fVar238;
    auVar38._24_4_ = auVar94._24_4_ * fVar238;
    auVar38._28_4_ = 0x3e2aaaab;
    auVar39._4_4_ = auVar92._4_4_ * fVar238;
    auVar39._0_4_ = auVar92._0_4_ * fVar238;
    auVar39._8_4_ = auVar92._8_4_ * fVar238;
    auVar39._12_4_ = auVar92._12_4_ * fVar238;
    auVar39._16_4_ = auVar92._16_4_ * fVar238;
    auVar39._20_4_ = auVar92._20_4_ * fVar238;
    auVar39._24_4_ = auVar92._24_4_ * fVar238;
    auVar39._28_4_ = 0x40c00000;
    fVar255 = auVar95._0_4_ * fVar238;
    fVar260 = auVar95._4_4_ * fVar238;
    auVar40._4_4_ = fVar260;
    auVar40._0_4_ = fVar255;
    fVar261 = auVar95._8_4_ * fVar238;
    auVar40._8_4_ = fVar261;
    fVar262 = auVar95._12_4_ * fVar238;
    auVar40._12_4_ = fVar262;
    fVar225 = auVar95._16_4_ * fVar238;
    auVar40._16_4_ = fVar225;
    fVar226 = auVar95._20_4_ * fVar238;
    auVar40._20_4_ = fVar226;
    fVar227 = auVar95._24_4_ * fVar238;
    auVar40._24_4_ = fVar227;
    auVar40._28_4_ = fVar238;
    auVar81 = vxorps_avx512vl(auVar275._0_16_,auVar275._0_16_);
    auVar115 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,ZEXT1632(auVar81));
    auVar263 = ZEXT3264(auVar115);
    auVar116 = vpermt2ps_avx512vl(auVar98,_DAT_01fb9fc0,ZEXT1632(auVar81));
    auVar264 = ZEXT3264(auVar116);
    auVar94 = ZEXT1632(auVar81);
    auVar117 = vpermt2ps_avx512vl(auVar101,_DAT_01fb9fc0,auVar94);
    auVar266 = ZEXT3264(auVar117);
    auVar233._0_4_ = fVar255 + auVar93._0_4_;
    auVar233._4_4_ = fVar260 + auVar93._4_4_;
    auVar233._8_4_ = fVar261 + auVar93._8_4_;
    auVar233._12_4_ = fVar262 + auVar93._12_4_;
    auVar233._16_4_ = fVar225 + auVar93._16_4_;
    auVar233._20_4_ = fVar226 + auVar93._20_4_;
    auVar233._24_4_ = fVar227 + auVar93._24_4_;
    auVar233._28_4_ = fVar238 + auVar93._28_4_;
    auVar114 = vmaxps_avx(auVar93,auVar233);
    auVar92 = vminps_avx(auVar93,auVar233);
    auVar103 = vpermt2ps_avx512vl(auVar93,_DAT_01fb9fc0,auVar94);
    auVar118 = vpermt2ps_avx512vl(auVar37,_DAT_01fb9fc0,auVar94);
    auVar245 = ZEXT3264(auVar118);
    auVar119 = vpermt2ps_avx512vl(auVar38,_DAT_01fb9fc0,auVar94);
    auVar133 = ZEXT1632(auVar81);
    auVar120 = vpermt2ps_avx512vl(auVar39,_DAT_01fb9fc0,auVar133);
    auVar93 = vpermt2ps_avx512vl(auVar40,_DAT_01fb9fc0,auVar133);
    auVar121 = vsubps_avx512vl(auVar103,auVar93);
    auVar93 = vsubps_avx(auVar115,auVar97);
    auVar259 = ZEXT3264(auVar93);
    auVar94 = vsubps_avx(auVar116,auVar98);
    auVar254 = ZEXT3264(auVar94);
    auVar95 = vsubps_avx(auVar117,auVar101);
    auVar96 = vmulps_avx512vl(auVar94,auVar39);
    auVar96 = vfmsub231ps_avx512vl(auVar96,auVar38,auVar95);
    auVar122 = vmulps_avx512vl(auVar95,auVar37);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar39,auVar93);
    auVar123 = vmulps_avx512vl(auVar93,auVar38);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar37,auVar94);
    auVar123 = vmulps_avx512vl(auVar123,auVar123);
    auVar122 = vfmadd231ps_avx512vl(auVar123,auVar122,auVar122);
    auVar122 = vfmadd231ps_avx512vl(auVar122,auVar96,auVar96);
    auVar96 = vmulps_avx512vl(auVar95,auVar95);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar94);
    auVar123 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar93);
    auVar124 = vrcp14ps_avx512vl(auVar123);
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar125 = vfnmadd213ps_avx512vl(auVar124,auVar123,auVar96);
    auVar124 = vfmadd132ps_avx512vl(auVar125,auVar124,auVar124);
    auVar122 = vmulps_avx512vl(auVar122,auVar124);
    auVar125 = vmulps_avx512vl(auVar94,auVar120);
    auVar125 = vfmsub231ps_avx512vl(auVar125,auVar119,auVar95);
    auVar126 = vmulps_avx512vl(auVar95,auVar118);
    auVar126 = vfmsub231ps_avx512vl(auVar126,auVar120,auVar93);
    auVar127 = vmulps_avx512vl(auVar93,auVar119);
    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar118,auVar94);
    auVar127 = vmulps_avx512vl(auVar127,auVar127);
    auVar126 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar126);
    auVar125 = vfmadd231ps_avx512vl(auVar126,auVar125,auVar125);
    auVar124 = vmulps_avx512vl(auVar125,auVar124);
    auVar122 = vmaxps_avx512vl(auVar122,auVar124);
    auVar122 = vsqrtps_avx512vl(auVar122);
    auVar124 = vmaxps_avx512vl(auVar121,auVar103);
    auVar114 = vmaxps_avx512vl(auVar114,auVar124);
    auVar124 = vaddps_avx512vl(auVar122,auVar114);
    auVar114 = vminps_avx512vl(auVar121,auVar103);
    auVar114 = vminps_avx(auVar92,auVar114);
    auVar114 = vsubps_avx512vl(auVar114,auVar122);
    auVar103._8_4_ = 0x3f800002;
    auVar103._0_8_ = 0x3f8000023f800002;
    auVar103._12_4_ = 0x3f800002;
    auVar103._16_4_ = 0x3f800002;
    auVar103._20_4_ = 0x3f800002;
    auVar103._24_4_ = 0x3f800002;
    auVar103._28_4_ = 0x3f800002;
    auVar92 = vmulps_avx512vl(auVar124,auVar103);
    auVar121._8_4_ = 0x3f7ffffc;
    auVar121._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar121._12_4_ = 0x3f7ffffc;
    auVar121._16_4_ = 0x3f7ffffc;
    auVar121._20_4_ = 0x3f7ffffc;
    auVar121._24_4_ = 0x3f7ffffc;
    auVar121._28_4_ = 0x3f7ffffc;
    auVar114 = vmulps_avx512vl(auVar114,auVar121);
    auVar92 = vmulps_avx512vl(auVar92,auVar92);
    auVar103 = vrsqrt14ps_avx512vl(auVar123);
    auVar122._8_4_ = 0xbf000000;
    auVar122._0_8_ = 0xbf000000bf000000;
    auVar122._12_4_ = 0xbf000000;
    auVar122._16_4_ = 0xbf000000;
    auVar122._20_4_ = 0xbf000000;
    auVar122._24_4_ = 0xbf000000;
    auVar122._28_4_ = 0xbf000000;
    auVar121 = vmulps_avx512vl(auVar123,auVar122);
    fVar255 = auVar103._0_4_;
    fVar260 = auVar103._4_4_;
    fVar261 = auVar103._8_4_;
    fVar262 = auVar103._12_4_;
    fVar225 = auVar103._16_4_;
    fVar226 = auVar103._20_4_;
    fVar227 = auVar103._24_4_;
    auVar41._4_4_ = fVar260 * fVar260 * fVar260 * auVar121._4_4_;
    auVar41._0_4_ = fVar255 * fVar255 * fVar255 * auVar121._0_4_;
    auVar41._8_4_ = fVar261 * fVar261 * fVar261 * auVar121._8_4_;
    auVar41._12_4_ = fVar262 * fVar262 * fVar262 * auVar121._12_4_;
    auVar41._16_4_ = fVar225 * fVar225 * fVar225 * auVar121._16_4_;
    auVar41._20_4_ = fVar226 * fVar226 * fVar226 * auVar121._20_4_;
    auVar41._24_4_ = fVar227 * fVar227 * fVar227 * auVar121._24_4_;
    auVar41._28_4_ = auVar124._28_4_;
    auVar123._8_4_ = 0x3fc00000;
    auVar123._0_8_ = 0x3fc000003fc00000;
    auVar123._12_4_ = 0x3fc00000;
    auVar123._16_4_ = 0x3fc00000;
    auVar123._20_4_ = 0x3fc00000;
    auVar123._24_4_ = 0x3fc00000;
    auVar123._28_4_ = 0x3fc00000;
    auVar103 = vfmadd231ps_avx512vl(auVar41,auVar103,auVar123);
    auVar121 = vmulps_avx512vl(auVar93,auVar103);
    auVar122 = vmulps_avx512vl(auVar94,auVar103);
    auVar123 = vmulps_avx512vl(auVar95,auVar103);
    auVar125 = vsubps_avx512vl(auVar133,auVar97);
    auVar126 = vsubps_avx512vl(auVar133,auVar98);
    auVar127 = vsubps_avx512vl(auVar133,auVar101);
    auVar124 = vmulps_avx512vl(local_5e0,auVar127);
    auVar124 = vfmadd231ps_avx512vl(auVar124,local_4a0,auVar126);
    auVar124 = vfmadd231ps_avx512vl(auVar124,local_5c0,auVar125);
    auVar128 = vmulps_avx512vl(auVar127,auVar127);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar126,auVar126);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar125,auVar125);
    auVar129 = vmulps_avx512vl(local_5e0,auVar123);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar122,local_4a0);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar121,local_5c0);
    auVar123 = vmulps_avx512vl(auVar127,auVar123);
    auVar122 = vfmadd231ps_avx512vl(auVar123,auVar126,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar125,auVar121);
    auVar122 = vmulps_avx512vl(auVar129,auVar129);
    auVar123 = vsubps_avx512vl(local_220,auVar122);
    auVar130 = vmulps_avx512vl(auVar129,auVar121);
    auVar124 = vsubps_avx512vl(auVar124,auVar130);
    auVar130 = vaddps_avx512vl(auVar124,auVar124);
    auVar124 = vmulps_avx512vl(auVar121,auVar121);
    local_820 = vsubps_avx512vl(auVar128,auVar124);
    auVar92 = vsubps_avx512vl(local_820,auVar92);
    local_740 = vmulps_avx512vl(auVar130,auVar130);
    auVar124._8_4_ = 0x40800000;
    auVar124._0_8_ = 0x4080000040800000;
    auVar124._12_4_ = 0x40800000;
    auVar124._16_4_ = 0x40800000;
    auVar124._20_4_ = 0x40800000;
    auVar124._24_4_ = 0x40800000;
    auVar124._28_4_ = 0x40800000;
    _local_8a0 = vmulps_avx512vl(auVar123,auVar124);
    auVar124 = vmulps_avx512vl(_local_8a0,auVar92);
    auVar124 = vsubps_avx512vl(local_740,auVar124);
    uVar76 = vcmpps_avx512vl(auVar124,auVar133,5);
    bVar65 = (byte)uVar76;
    fVar255 = (float)local_760._0_4_;
    fVar260 = (float)local_760._4_4_;
    fVar261 = fStack_758;
    fVar262 = fStack_754;
    fVar225 = fStack_750;
    fVar226 = fStack_74c;
    fVar227 = fStack_748;
    fVar239 = fStack_744;
    if (bVar65 == 0) {
LAB_01b2c7c5:
      auVar275 = ZEXT3264(auVar96);
      auVar249 = ZEXT3264(CONCAT428(0x7fffffff,
                                    CONCAT424(0x7fffffff,
                                              CONCAT420(0x7fffffff,
                                                        CONCAT416(0x7fffffff,
                                                                  CONCAT412(0x7fffffff,
                                                                            CONCAT48(0x7fffffff,
                                                                                                                                                                          
                                                  0x7fffffff7fffffff)))))));
      auVar114 = vmovdqa64_avx512vl(auVar110);
      auVar274 = ZEXT3264(auVar114);
    }
    else {
      auVar124 = vsqrtps_avx512vl(auVar124);
      auVar128 = vaddps_avx512vl(auVar123,auVar123);
      local_8c0 = vrcp14ps_avx512vl(auVar128);
      auVar96 = vfnmadd213ps_avx512vl(local_8c0,auVar128,auVar96);
      auVar96 = vfmadd132ps_avx512vl(auVar96,local_8c0,local_8c0);
      _local_620 = vxorps_avx512vl(auVar130,auVar102);
      auVar102 = vsubps_avx512vl(_local_620,auVar124);
      local_600 = vmulps_avx512vl(auVar102,auVar96);
      auVar102 = vsubps_avx512vl(auVar124,auVar130);
      local_640 = vmulps_avx512vl(auVar102,auVar96);
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar102 = vblendmps_avx512vl(auVar96,local_600);
      auVar131._0_4_ =
           (uint)(bVar65 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar96._0_4_;
      bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar131._4_4_ = (uint)bVar75 * auVar102._4_4_ | (uint)!bVar75 * auVar96._4_4_;
      bVar75 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar131._8_4_ = (uint)bVar75 * auVar102._8_4_ | (uint)!bVar75 * auVar96._8_4_;
      bVar75 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar131._12_4_ = (uint)bVar75 * auVar102._12_4_ | (uint)!bVar75 * auVar96._12_4_;
      bVar75 = (bool)((byte)(uVar76 >> 4) & 1);
      auVar131._16_4_ = (uint)bVar75 * auVar102._16_4_ | (uint)!bVar75 * auVar96._16_4_;
      bVar75 = (bool)((byte)(uVar76 >> 5) & 1);
      auVar131._20_4_ = (uint)bVar75 * auVar102._20_4_ | (uint)!bVar75 * auVar96._20_4_;
      bVar75 = (bool)((byte)(uVar76 >> 6) & 1);
      auVar131._24_4_ = (uint)bVar75 * auVar102._24_4_ | (uint)!bVar75 * auVar96._24_4_;
      bVar75 = SUB81(uVar76 >> 7,0);
      auVar131._28_4_ = (uint)bVar75 * auVar102._28_4_ | (uint)!bVar75 * auVar96._28_4_;
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar102 = vblendmps_avx512vl(auVar96,local_640);
      auVar132._0_4_ =
           (uint)(bVar65 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar96._0_4_;
      bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
      auVar132._4_4_ = (uint)bVar75 * auVar102._4_4_ | (uint)!bVar75 * auVar96._4_4_;
      bVar75 = (bool)((byte)(uVar76 >> 2) & 1);
      auVar132._8_4_ = (uint)bVar75 * auVar102._8_4_ | (uint)!bVar75 * auVar96._8_4_;
      bVar75 = (bool)((byte)(uVar76 >> 3) & 1);
      auVar132._12_4_ = (uint)bVar75 * auVar102._12_4_ | (uint)!bVar75 * auVar96._12_4_;
      bVar75 = (bool)((byte)(uVar76 >> 4) & 1);
      auVar132._16_4_ = (uint)bVar75 * auVar102._16_4_ | (uint)!bVar75 * auVar96._16_4_;
      bVar75 = (bool)((byte)(uVar76 >> 5) & 1);
      auVar132._20_4_ = (uint)bVar75 * auVar102._20_4_ | (uint)!bVar75 * auVar96._20_4_;
      bVar75 = (bool)((byte)(uVar76 >> 6) & 1);
      auVar132._24_4_ = (uint)bVar75 * auVar102._24_4_ | (uint)!bVar75 * auVar96._24_4_;
      bVar75 = SUB81(uVar76 >> 7,0);
      auVar132._28_4_ = (uint)bVar75 * auVar102._28_4_ | (uint)!bVar75 * auVar96._28_4_;
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar122,auVar96);
      local_660 = vmaxps_avx512vl(local_240,auVar96);
      auVar30._8_4_ = 0x36000000;
      auVar30._0_8_ = 0x3600000036000000;
      auVar30._12_4_ = 0x36000000;
      auVar30._16_4_ = 0x36000000;
      auVar30._20_4_ = 0x36000000;
      auVar30._24_4_ = 0x36000000;
      auVar30._28_4_ = 0x36000000;
      local_680 = vmulps_avx512vl(local_660,auVar30);
      vandps_avx512vl(auVar123,auVar96);
      uVar20 = vcmpps_avx512vl(local_680,local_680,1);
      uVar76 = uVar76 & uVar20;
      bVar72 = (byte)uVar76;
      if (bVar72 != 0) {
        uVar20 = vcmpps_avx512vl(auVar92,_DAT_01f7b000,2);
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar102 = vblendmps_avx512vl(auVar92,auVar96);
        bVar71 = (byte)uVar20;
        uVar77 = (uint)(bVar71 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar71 & 1) * local_680._0_4_;
        bVar75 = (bool)((byte)(uVar20 >> 1) & 1);
        uVar144 = (uint)bVar75 * auVar102._4_4_ | (uint)!bVar75 * local_680._4_4_;
        bVar75 = (bool)((byte)(uVar20 >> 2) & 1);
        uVar145 = (uint)bVar75 * auVar102._8_4_ | (uint)!bVar75 * local_680._8_4_;
        bVar75 = (bool)((byte)(uVar20 >> 3) & 1);
        uVar146 = (uint)bVar75 * auVar102._12_4_ | (uint)!bVar75 * local_680._12_4_;
        bVar75 = (bool)((byte)(uVar20 >> 4) & 1);
        uVar147 = (uint)bVar75 * auVar102._16_4_ | (uint)!bVar75 * local_680._16_4_;
        bVar75 = (bool)((byte)(uVar20 >> 5) & 1);
        uVar148 = (uint)bVar75 * auVar102._20_4_ | (uint)!bVar75 * local_680._20_4_;
        bVar75 = (bool)((byte)(uVar20 >> 6) & 1);
        uVar149 = (uint)bVar75 * auVar102._24_4_ | (uint)!bVar75 * local_680._24_4_;
        bVar75 = SUB81(uVar20 >> 7,0);
        uVar150 = (uint)bVar75 * auVar102._28_4_ | (uint)!bVar75 * local_680._28_4_;
        auVar131._0_4_ = (bVar72 & 1) * uVar77 | !(bool)(bVar72 & 1) * auVar131._0_4_;
        bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar131._4_4_ = bVar75 * uVar144 | !bVar75 * auVar131._4_4_;
        bVar75 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar131._8_4_ = bVar75 * uVar145 | !bVar75 * auVar131._8_4_;
        bVar75 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar131._12_4_ = bVar75 * uVar146 | !bVar75 * auVar131._12_4_;
        bVar75 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar131._16_4_ = bVar75 * uVar147 | !bVar75 * auVar131._16_4_;
        bVar75 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar131._20_4_ = bVar75 * uVar148 | !bVar75 * auVar131._20_4_;
        bVar75 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar131._24_4_ = bVar75 * uVar149 | !bVar75 * auVar131._24_4_;
        bVar75 = SUB81(uVar76 >> 7,0);
        auVar131._28_4_ = bVar75 * uVar150 | !bVar75 * auVar131._28_4_;
        auVar92 = vblendmps_avx512vl(auVar96,auVar92);
        bVar75 = (bool)((byte)(uVar20 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar20 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar20 >> 3) & 1);
        bVar14 = (bool)((byte)(uVar20 >> 4) & 1);
        bVar15 = (bool)((byte)(uVar20 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar20 >> 6) & 1);
        bVar17 = SUB81(uVar20 >> 7,0);
        auVar132._0_4_ =
             (uint)(bVar72 & 1) *
             ((uint)(bVar71 & 1) * auVar92._0_4_ | !(bool)(bVar71 & 1) * uVar77) |
             !(bool)(bVar72 & 1) * auVar132._0_4_;
        bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
        auVar132._4_4_ =
             (uint)bVar11 * ((uint)bVar75 * auVar92._4_4_ | !bVar75 * uVar144) |
             !bVar11 * auVar132._4_4_;
        bVar75 = (bool)((byte)(uVar76 >> 2) & 1);
        auVar132._8_4_ =
             (uint)bVar75 * ((uint)bVar12 * auVar92._8_4_ | !bVar12 * uVar145) |
             !bVar75 * auVar132._8_4_;
        bVar75 = (bool)((byte)(uVar76 >> 3) & 1);
        auVar132._12_4_ =
             (uint)bVar75 * ((uint)bVar13 * auVar92._12_4_ | !bVar13 * uVar146) |
             !bVar75 * auVar132._12_4_;
        bVar75 = (bool)((byte)(uVar76 >> 4) & 1);
        auVar132._16_4_ =
             (uint)bVar75 * ((uint)bVar14 * auVar92._16_4_ | !bVar14 * uVar147) |
             !bVar75 * auVar132._16_4_;
        bVar75 = (bool)((byte)(uVar76 >> 5) & 1);
        auVar132._20_4_ =
             (uint)bVar75 * ((uint)bVar15 * auVar92._20_4_ | !bVar15 * uVar148) |
             !bVar75 * auVar132._20_4_;
        bVar75 = (bool)((byte)(uVar76 >> 6) & 1);
        auVar132._24_4_ =
             (uint)bVar75 * ((uint)bVar16 * auVar92._24_4_ | !bVar16 * uVar149) |
             !bVar75 * auVar132._24_4_;
        bVar75 = SUB81(uVar76 >> 7,0);
        auVar132._28_4_ =
             (uint)bVar75 * ((uint)bVar17 * auVar92._28_4_ | !bVar17 * uVar150) |
             !bVar75 * auVar132._28_4_;
        bVar65 = (~bVar72 | bVar71) & bVar65;
      }
      if ((bVar65 & 0x7f) == 0) {
        auVar249 = ZEXT3264(CONCAT428(0x7fffffff,
                                      CONCAT424(0x7fffffff,
                                                CONCAT420(0x7fffffff,
                                                          CONCAT416(0x7fffffff,
                                                                    CONCAT412(0x7fffffff,
                                                                              CONCAT48(0x7fffffff,
                                                                                                                                                                              
                                                  0x7fffffff7fffffff)))))));
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar275 = ZEXT3264(auVar114);
        auVar114 = vmovdqa64_avx512vl(auVar110);
        auVar274 = ZEXT3264(auVar114);
      }
      else {
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar102 = vxorps_avx512vl(auVar120,auVar92);
        auVar122 = vxorps_avx512vl(auVar118,auVar92);
        auVar245 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
        auVar123 = vxorps_avx512vl(auVar119,auVar92);
        auVar81 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                                 ZEXT416((uint)local_6f0._0_4_));
        auVar96 = vbroadcastss_avx512vl(auVar81);
        auVar124 = vminps_avx512vl(auVar96,auVar132);
        auVar63._4_4_ = fStack_2dc;
        auVar63._0_4_ = local_2e0;
        auVar63._8_4_ = fStack_2d8;
        auVar63._12_4_ = fStack_2d4;
        auVar63._16_4_ = fStack_2d0;
        auVar63._20_4_ = fStack_2cc;
        auVar63._24_4_ = fStack_2c8;
        auVar63._28_4_ = fStack_2c4;
        auVar118 = vmaxps_avx512vl(auVar63,auVar131);
        auVar96 = vmulps_avx512vl(auVar39,auVar127);
        auVar96 = vfmadd213ps_avx512vl(auVar126,auVar38,auVar96);
        auVar81 = vfmadd213ps_fma(auVar125,auVar37,auVar96);
        auVar96 = vmulps_avx512vl(local_5e0,auVar39);
        auVar96 = vfmadd231ps_avx512vl(auVar96,local_4a0,auVar38);
        auVar119 = vfmadd231ps_avx512vl(auVar96,local_5c0,auVar37);
        auVar120 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar119,auVar120);
        auVar125 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar19 = vcmpps_avx512vl(auVar120,auVar125,1);
        auVar126 = vxorps_avx512vl(ZEXT1632(auVar81),auVar92);
        auVar127 = vrcp14ps_avx512vl(auVar119);
        auVar133 = vxorps_avx512vl(auVar119,auVar92);
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar134 = vfnmadd213ps_avx512vl(auVar127,auVar119,auVar96);
        auVar81 = vfmadd132ps_fma(auVar134,auVar127,auVar127);
        fVar228 = auVar81._0_4_ * auVar126._0_4_;
        fVar236 = auVar81._4_4_ * auVar126._4_4_;
        auVar42._4_4_ = fVar236;
        auVar42._0_4_ = fVar228;
        fVar237 = auVar81._8_4_ * auVar126._8_4_;
        auVar42._8_4_ = fVar237;
        fVar238 = auVar81._12_4_ * auVar126._12_4_;
        auVar42._12_4_ = fVar238;
        fVar151 = auVar126._16_4_ * 0.0;
        auVar42._16_4_ = fVar151;
        fVar168 = auVar126._20_4_ * 0.0;
        auVar42._20_4_ = fVar168;
        fVar169 = auVar126._24_4_ * 0.0;
        auVar42._24_4_ = fVar169;
        auVar42._28_4_ = auVar126._28_4_;
        uVar22 = vcmpps_avx512vl(auVar119,auVar133,1);
        bVar72 = (byte)uVar19 | (byte)uVar22;
        auVar269._8_4_ = 0xff800000;
        auVar269._0_8_ = 0xff800000ff800000;
        auVar269._12_4_ = 0xff800000;
        auVar269._16_4_ = 0xff800000;
        auVar269._20_4_ = 0xff800000;
        auVar269._24_4_ = 0xff800000;
        auVar269._28_4_ = 0xff800000;
        auVar127 = vblendmps_avx512vl(auVar42,auVar269);
        auVar135._0_4_ = (uint)(bVar72 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar72 & 1) * -0x800000
        ;
        bVar75 = (bool)(bVar72 >> 1 & 1);
        auVar135._4_4_ = (uint)bVar75 * auVar127._4_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)(bVar72 >> 2 & 1);
        auVar135._8_4_ = (uint)bVar75 * auVar127._8_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)(bVar72 >> 3 & 1);
        auVar135._12_4_ = (uint)bVar75 * auVar127._12_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)(bVar72 >> 4 & 1);
        auVar135._16_4_ = (uint)bVar75 * auVar127._16_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)(bVar72 >> 5 & 1);
        auVar135._20_4_ = (uint)bVar75 * auVar127._20_4_ | (uint)!bVar75 * -0x800000;
        bVar75 = (bool)(bVar72 >> 6 & 1);
        auVar135._24_4_ = (uint)bVar75 * auVar127._24_4_ | (uint)!bVar75 * -0x800000;
        auVar135._28_4_ =
             (uint)(bVar72 >> 7) * auVar127._28_4_ | (uint)!(bool)(bVar72 >> 7) * -0x800000;
        auVar127 = vmaxps_avx512vl(auVar118,auVar135);
        auVar271 = ZEXT3264(auVar127);
        uVar22 = vcmpps_avx512vl(auVar119,auVar133,6);
        bVar72 = (byte)uVar19 | (byte)uVar22;
        auVar136._0_4_ = (uint)(bVar72 & 1) * 0x7f800000 | (uint)!(bool)(bVar72 & 1) * (int)fVar228;
        bVar75 = (bool)(bVar72 >> 1 & 1);
        auVar136._4_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar236;
        bVar75 = (bool)(bVar72 >> 2 & 1);
        auVar136._8_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar237;
        bVar75 = (bool)(bVar72 >> 3 & 1);
        auVar136._12_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar238;
        bVar75 = (bool)(bVar72 >> 4 & 1);
        auVar136._16_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar151;
        bVar75 = (bool)(bVar72 >> 5 & 1);
        auVar136._20_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar168;
        bVar75 = (bool)(bVar72 >> 6 & 1);
        auVar136._24_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar169;
        auVar136._28_4_ =
             (uint)(bVar72 >> 7) * 0x7f800000 | (uint)!(bool)(bVar72 >> 7) * auVar126._28_4_;
        auVar124 = vminps_avx512vl(auVar124,auVar136);
        auVar81 = vxorps_avx512vl(auVar118._0_16_,auVar118._0_16_);
        auVar115 = vsubps_avx512vl(ZEXT1632(auVar81),auVar115);
        auVar116 = vsubps_avx512vl(ZEXT1632(auVar81),auVar116);
        auVar118 = ZEXT1632(auVar81);
        auVar117 = vsubps_avx512vl(auVar118,auVar117);
        auVar117 = vmulps_avx512vl(auVar117,auVar102);
        auVar116 = vfmadd231ps_avx512vl(auVar117,auVar123,auVar116);
        auVar115 = vfmadd231ps_avx512vl(auVar116,auVar122,auVar115);
        auVar102 = vmulps_avx512vl(local_5e0,auVar102);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_4a0,auVar123);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_5c0,auVar122);
        vandps_avx512vl(auVar102,auVar120);
        uVar19 = vcmpps_avx512vl(auVar102,auVar125,1);
        auVar115 = vxorps_avx512vl(auVar115,auVar92);
        auVar122 = vrcp14ps_avx512vl(auVar102);
        auVar92 = vxorps_avx512vl(auVar102,auVar92);
        auVar266 = ZEXT3264(auVar92);
        auVar123 = vfnmadd213ps_avx512vl(auVar122,auVar102,auVar96);
        auVar81 = vfmadd132ps_fma(auVar123,auVar122,auVar122);
        fVar228 = auVar81._0_4_ * auVar115._0_4_;
        fVar236 = auVar81._4_4_ * auVar115._4_4_;
        auVar43._4_4_ = fVar236;
        auVar43._0_4_ = fVar228;
        fVar237 = auVar81._8_4_ * auVar115._8_4_;
        auVar43._8_4_ = fVar237;
        fVar238 = auVar81._12_4_ * auVar115._12_4_;
        auVar43._12_4_ = fVar238;
        fVar151 = auVar115._16_4_ * 0.0;
        auVar43._16_4_ = fVar151;
        fVar168 = auVar115._20_4_ * 0.0;
        auVar43._20_4_ = fVar168;
        fVar169 = auVar115._24_4_ * 0.0;
        auVar43._24_4_ = fVar169;
        auVar43._28_4_ = auVar115._28_4_;
        uVar22 = vcmpps_avx512vl(auVar102,auVar92,1);
        bVar72 = (byte)uVar19 | (byte)uVar22;
        auVar31._8_4_ = 0xff800000;
        auVar31._0_8_ = 0xff800000ff800000;
        auVar31._12_4_ = 0xff800000;
        auVar31._16_4_ = 0xff800000;
        auVar31._20_4_ = 0xff800000;
        auVar31._24_4_ = 0xff800000;
        auVar31._28_4_ = 0xff800000;
        auVar123 = vblendmps_avx512vl(auVar43,auVar31);
        auVar137._0_4_ =
             (uint)(bVar72 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar122._0_4_;
        bVar75 = (bool)(bVar72 >> 1 & 1);
        auVar137._4_4_ = (uint)bVar75 * auVar123._4_4_ | (uint)!bVar75 * auVar122._4_4_;
        bVar75 = (bool)(bVar72 >> 2 & 1);
        auVar137._8_4_ = (uint)bVar75 * auVar123._8_4_ | (uint)!bVar75 * auVar122._8_4_;
        bVar75 = (bool)(bVar72 >> 3 & 1);
        auVar137._12_4_ = (uint)bVar75 * auVar123._12_4_ | (uint)!bVar75 * auVar122._12_4_;
        bVar75 = (bool)(bVar72 >> 4 & 1);
        auVar137._16_4_ = (uint)bVar75 * auVar123._16_4_ | (uint)!bVar75 * auVar122._16_4_;
        bVar75 = (bool)(bVar72 >> 5 & 1);
        auVar137._20_4_ = (uint)bVar75 * auVar123._20_4_ | (uint)!bVar75 * auVar122._20_4_;
        bVar75 = (bool)(bVar72 >> 6 & 1);
        auVar137._24_4_ = (uint)bVar75 * auVar123._24_4_ | (uint)!bVar75 * auVar122._24_4_;
        auVar137._28_4_ =
             (uint)(bVar72 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar72 >> 7) * auVar122._28_4_;
        local_5a0 = vmaxps_avx(auVar127,auVar137);
        auVar264 = ZEXT3264(local_5a0);
        uVar22 = vcmpps_avx512vl(auVar102,auVar92,6);
        bVar72 = (byte)uVar19 | (byte)uVar22;
        auVar138._0_4_ = (uint)(bVar72 & 1) * 0x7f800000 | (uint)!(bool)(bVar72 & 1) * (int)fVar228;
        bVar75 = (bool)(bVar72 >> 1 & 1);
        auVar138._4_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar236;
        bVar75 = (bool)(bVar72 >> 2 & 1);
        auVar138._8_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar237;
        bVar75 = (bool)(bVar72 >> 3 & 1);
        auVar138._12_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar238;
        bVar75 = (bool)(bVar72 >> 4 & 1);
        auVar138._16_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar151;
        bVar75 = (bool)(bVar72 >> 5 & 1);
        auVar138._20_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar168;
        bVar75 = (bool)(bVar72 >> 6 & 1);
        auVar138._24_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar169;
        auVar138._28_4_ =
             (uint)(bVar72 >> 7) * 0x7f800000 | (uint)!(bool)(bVar72 >> 7) * auVar115._28_4_;
        local_340 = vminps_avx(auVar124,auVar138);
        auVar263 = ZEXT3264(local_340);
        uVar19 = vcmpps_avx512vl(local_5a0,local_340,2);
        bVar65 = bVar65 & 0x7f & (byte)uVar19;
        if (bVar65 == 0) goto LAB_01b2c7c5;
        auVar92 = vmaxps_avx512vl(auVar118,auVar114);
        auVar114 = vfmadd213ps_avx512vl(local_600,auVar129,auVar121);
        fVar228 = auVar103._0_4_;
        fVar236 = auVar103._4_4_;
        auVar44._4_4_ = fVar236 * auVar114._4_4_;
        auVar44._0_4_ = fVar228 * auVar114._0_4_;
        fVar237 = auVar103._8_4_;
        auVar44._8_4_ = fVar237 * auVar114._8_4_;
        fVar238 = auVar103._12_4_;
        auVar44._12_4_ = fVar238 * auVar114._12_4_;
        fVar151 = auVar103._16_4_;
        auVar44._16_4_ = fVar151 * auVar114._16_4_;
        fVar168 = auVar103._20_4_;
        auVar44._20_4_ = fVar168 * auVar114._20_4_;
        fVar169 = auVar103._24_4_;
        auVar44._24_4_ = fVar169 * auVar114._24_4_;
        auVar44._28_4_ = auVar114._28_4_;
        auVar114 = vfmadd213ps_avx512vl(local_640,auVar129,auVar121);
        auVar45._4_4_ = fVar236 * auVar114._4_4_;
        auVar45._0_4_ = fVar228 * auVar114._0_4_;
        auVar45._8_4_ = fVar237 * auVar114._8_4_;
        auVar45._12_4_ = fVar238 * auVar114._12_4_;
        auVar45._16_4_ = fVar151 * auVar114._16_4_;
        auVar45._20_4_ = fVar168 * auVar114._20_4_;
        auVar45._24_4_ = fVar169 * auVar114._24_4_;
        auVar45._28_4_ = auVar114._28_4_;
        auVar114 = vminps_avx512vl(auVar44,auVar96);
        auVar51 = ZEXT812(0);
        auVar102 = ZEXT1232(auVar51) << 0x20;
        auVar114 = vmaxps_avx(auVar114,ZEXT1232(auVar51) << 0x20);
        auVar115 = vminps_avx512vl(auVar45,auVar96);
        auVar46._4_4_ = (auVar114._4_4_ + 1.0) * 0.125;
        auVar46._0_4_ = (auVar114._0_4_ + 0.0) * 0.125;
        auVar46._8_4_ = (auVar114._8_4_ + 2.0) * 0.125;
        auVar46._12_4_ = (auVar114._12_4_ + 3.0) * 0.125;
        auVar46._16_4_ = (auVar114._16_4_ + 4.0) * 0.125;
        auVar46._20_4_ = (auVar114._20_4_ + 5.0) * 0.125;
        auVar46._24_4_ = (auVar114._24_4_ + 6.0) * 0.125;
        auVar46._28_4_ = auVar114._28_4_ + 7.0;
        local_1a0 = vfmadd213ps_avx512vl(auVar46,auVar159,local_880);
        auVar114 = vmaxps_avx(auVar115,ZEXT1232(auVar51) << 0x20);
        auVar47._4_4_ = (auVar114._4_4_ + 1.0) * 0.125;
        auVar47._0_4_ = (auVar114._0_4_ + 0.0) * 0.125;
        auVar47._8_4_ = (auVar114._8_4_ + 2.0) * 0.125;
        auVar47._12_4_ = (auVar114._12_4_ + 3.0) * 0.125;
        auVar47._16_4_ = (auVar114._16_4_ + 4.0) * 0.125;
        auVar47._20_4_ = (auVar114._20_4_ + 5.0) * 0.125;
        auVar47._24_4_ = (auVar114._24_4_ + 6.0) * 0.125;
        auVar47._28_4_ = auVar114._28_4_ + 7.0;
        local_1c0 = vfmadd213ps_avx512vl(auVar47,auVar159,local_880);
        auVar48._4_4_ = auVar92._4_4_ * auVar92._4_4_;
        auVar48._0_4_ = auVar92._0_4_ * auVar92._0_4_;
        auVar48._8_4_ = auVar92._8_4_ * auVar92._8_4_;
        auVar48._12_4_ = auVar92._12_4_ * auVar92._12_4_;
        auVar48._16_4_ = auVar92._16_4_ * auVar92._16_4_;
        auVar48._20_4_ = auVar92._20_4_ * auVar92._20_4_;
        auVar48._24_4_ = auVar92._24_4_ * auVar92._24_4_;
        auVar48._28_4_ = auVar92._28_4_;
        auVar114 = vsubps_avx(local_820,auVar48);
        auVar271 = ZEXT3264(auVar114);
        auVar49._4_4_ = auVar114._4_4_ * (float)local_8a0._4_4_;
        auVar49._0_4_ = auVar114._0_4_ * (float)local_8a0._0_4_;
        auVar49._8_4_ = auVar114._8_4_ * fStack_898;
        auVar49._12_4_ = auVar114._12_4_ * fStack_894;
        auVar49._16_4_ = auVar114._16_4_ * fStack_890;
        auVar49._20_4_ = auVar114._20_4_ * fStack_88c;
        auVar49._24_4_ = auVar114._24_4_ * fStack_888;
        auVar49._28_4_ = auVar92._28_4_;
        auVar92 = vsubps_avx(local_740,auVar49);
        uVar19 = vcmpps_avx512vl(auVar92,ZEXT1232(auVar51) << 0x20,5);
        bVar72 = (byte)uVar19;
        if (bVar72 == 0) {
          bVar72 = 0;
          auVar93 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar92 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar96 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar264 = ZEXT864(0) << 0x20;
          auVar139._8_4_ = 0x7f800000;
          auVar139._0_8_ = 0x7f8000007f800000;
          auVar139._12_4_ = 0x7f800000;
          auVar139._16_4_ = 0x7f800000;
          auVar139._20_4_ = 0x7f800000;
          auVar139._24_4_ = 0x7f800000;
          auVar139._28_4_ = 0x7f800000;
          auVar140._8_4_ = 0xff800000;
          auVar140._0_8_ = 0xff800000ff800000;
          auVar140._12_4_ = 0xff800000;
          auVar140._16_4_ = 0xff800000;
          auVar140._20_4_ = 0xff800000;
          auVar140._24_4_ = 0xff800000;
          auVar140._28_4_ = 0xff800000;
        }
        else {
          auVar82 = vxorps_avx512vl(auVar152,auVar152);
          uVar76 = vcmpps_avx512vl(auVar92,auVar118,5);
          auVar92 = vsqrtps_avx(auVar92);
          auVar96 = vfnmadd213ps_avx512vl(auVar128,local_8c0,auVar96);
          auVar102 = vfmadd132ps_avx512vl(auVar96,local_8c0,local_8c0);
          auVar96 = vsubps_avx(_local_620,auVar92);
          auVar122 = vmulps_avx512vl(auVar96,auVar102);
          auVar92 = vsubps_avx512vl(auVar92,auVar130);
          auVar123 = vmulps_avx512vl(auVar92,auVar102);
          auVar92 = vfmadd213ps_avx512vl(auVar129,auVar122,auVar121);
          auVar50._4_4_ = fVar236 * auVar92._4_4_;
          auVar50._0_4_ = fVar228 * auVar92._0_4_;
          auVar50._8_4_ = fVar237 * auVar92._8_4_;
          auVar50._12_4_ = fVar238 * auVar92._12_4_;
          auVar50._16_4_ = fVar151 * auVar92._16_4_;
          auVar50._20_4_ = fVar168 * auVar92._20_4_;
          auVar50._24_4_ = fVar169 * auVar92._24_4_;
          auVar50._28_4_ = auVar115._28_4_;
          auVar92 = vmulps_avx512vl(local_5c0,auVar122);
          auVar96 = vmulps_avx512vl(local_4a0,auVar122);
          auVar102 = vmulps_avx512vl(local_5e0,auVar122);
          auVar115 = vfmadd213ps_avx512vl(auVar93,auVar50,auVar97);
          auVar92 = vsubps_avx512vl(auVar92,auVar115);
          auVar115 = vfmadd213ps_avx512vl(auVar94,auVar50,auVar98);
          auVar96 = vsubps_avx512vl(auVar96,auVar115);
          auVar81 = vfmadd213ps_fma(auVar50,auVar95,auVar101);
          auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar81));
          auVar264 = ZEXT3264(auVar102);
          auVar102 = vfmadd213ps_avx512vl(auVar129,auVar123,auVar121);
          auVar103 = vmulps_avx512vl(auVar103,auVar102);
          auVar102 = vmulps_avx512vl(local_5c0,auVar123);
          auVar115 = vmulps_avx512vl(local_4a0,auVar123);
          auVar121 = vmulps_avx512vl(local_5e0,auVar123);
          auVar81 = vfmadd213ps_fma(auVar93,auVar103,auVar97);
          auVar102 = vsubps_avx(auVar102,ZEXT1632(auVar81));
          auVar81 = vfmadd213ps_fma(auVar94,auVar103,auVar98);
          auVar93 = vsubps_avx512vl(auVar115,ZEXT1632(auVar81));
          auVar81 = vfmadd213ps_fma(auVar95,auVar103,auVar101);
          auVar94 = vsubps_avx512vl(auVar121,ZEXT1632(auVar81));
          auVar160._8_4_ = 0x7f800000;
          auVar160._0_8_ = 0x7f8000007f800000;
          auVar160._12_4_ = 0x7f800000;
          auVar160._16_4_ = 0x7f800000;
          auVar160._20_4_ = 0x7f800000;
          auVar160._24_4_ = 0x7f800000;
          auVar160._28_4_ = 0x7f800000;
          auVar95 = vblendmps_avx512vl(auVar160,auVar122);
          bVar75 = (bool)((byte)uVar76 & 1);
          auVar139._0_4_ = (uint)bVar75 * auVar95._0_4_ | (uint)!bVar75 * auVar97._0_4_;
          bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar139._4_4_ = (uint)bVar75 * auVar95._4_4_ | (uint)!bVar75 * auVar97._4_4_;
          bVar75 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar139._8_4_ = (uint)bVar75 * auVar95._8_4_ | (uint)!bVar75 * auVar97._8_4_;
          bVar75 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar139._12_4_ = (uint)bVar75 * auVar95._12_4_ | (uint)!bVar75 * auVar97._12_4_;
          bVar75 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar139._16_4_ = (uint)bVar75 * auVar95._16_4_ | (uint)!bVar75 * auVar97._16_4_;
          bVar75 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar139._20_4_ = (uint)bVar75 * auVar95._20_4_ | (uint)!bVar75 * auVar97._20_4_;
          bVar75 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar139._24_4_ = (uint)bVar75 * auVar95._24_4_ | (uint)!bVar75 * auVar97._24_4_;
          bVar75 = SUB81(uVar76 >> 7,0);
          auVar139._28_4_ = (uint)bVar75 * auVar95._28_4_ | (uint)!bVar75 * auVar97._28_4_;
          auVar161._8_4_ = 0xff800000;
          auVar161._0_8_ = 0xff800000ff800000;
          auVar161._12_4_ = 0xff800000;
          auVar161._16_4_ = 0xff800000;
          auVar161._20_4_ = 0xff800000;
          auVar161._24_4_ = 0xff800000;
          auVar161._28_4_ = 0xff800000;
          auVar95 = vblendmps_avx512vl(auVar161,auVar123);
          bVar75 = (bool)((byte)uVar76 & 1);
          auVar140._0_4_ = (uint)bVar75 * auVar95._0_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
          auVar140._4_4_ = (uint)bVar75 * auVar95._4_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar76 >> 2) & 1);
          auVar140._8_4_ = (uint)bVar75 * auVar95._8_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar76 >> 3) & 1);
          auVar140._12_4_ = (uint)bVar75 * auVar95._12_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar76 >> 4) & 1);
          auVar140._16_4_ = (uint)bVar75 * auVar95._16_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar76 >> 5) & 1);
          auVar140._20_4_ = (uint)bVar75 * auVar95._20_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar76 >> 6) & 1);
          auVar140._24_4_ = (uint)bVar75 * auVar95._24_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = SUB81(uVar76 >> 7,0);
          auVar140._28_4_ = (uint)bVar75 * auVar95._28_4_ | (uint)!bVar75 * -0x800000;
          auVar32._8_4_ = 0x36000000;
          auVar32._0_8_ = 0x3600000036000000;
          auVar32._12_4_ = 0x36000000;
          auVar32._16_4_ = 0x36000000;
          auVar32._20_4_ = 0x36000000;
          auVar32._24_4_ = 0x36000000;
          auVar32._28_4_ = 0x36000000;
          auVar95 = vmulps_avx512vl(local_660,auVar32);
          uVar20 = vcmpps_avx512vl(auVar95,local_680,0xe);
          uVar76 = uVar76 & uVar20;
          bVar71 = (byte)uVar76;
          if (bVar71 != 0) {
            uVar20 = vcmpps_avx512vl(auVar114,ZEXT1632(auVar82),2);
            auVar258._8_4_ = 0x7f800000;
            auVar258._0_8_ = 0x7f8000007f800000;
            auVar258._12_4_ = 0x7f800000;
            auVar258._16_4_ = 0x7f800000;
            auVar258._20_4_ = 0x7f800000;
            auVar258._24_4_ = 0x7f800000;
            auVar258._28_4_ = 0x7f800000;
            auVar270._8_4_ = 0xff800000;
            auVar270._0_8_ = 0xff800000ff800000;
            auVar270._12_4_ = 0xff800000;
            auVar270._16_4_ = 0xff800000;
            auVar270._20_4_ = 0xff800000;
            auVar270._24_4_ = 0xff800000;
            auVar270._28_4_ = 0xff800000;
            auVar271 = ZEXT3264(auVar270);
            auVar114 = vblendmps_avx512vl(auVar258,auVar270);
            bVar66 = (byte)uVar20;
            uVar77 = (uint)(bVar66 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar95._0_4_
            ;
            bVar75 = (bool)((byte)(uVar20 >> 1) & 1);
            uVar144 = (uint)bVar75 * auVar114._4_4_ | (uint)!bVar75 * auVar95._4_4_;
            bVar75 = (bool)((byte)(uVar20 >> 2) & 1);
            uVar145 = (uint)bVar75 * auVar114._8_4_ | (uint)!bVar75 * auVar95._8_4_;
            bVar75 = (bool)((byte)(uVar20 >> 3) & 1);
            uVar146 = (uint)bVar75 * auVar114._12_4_ | (uint)!bVar75 * auVar95._12_4_;
            bVar75 = (bool)((byte)(uVar20 >> 4) & 1);
            uVar147 = (uint)bVar75 * auVar114._16_4_ | (uint)!bVar75 * auVar95._16_4_;
            bVar75 = (bool)((byte)(uVar20 >> 5) & 1);
            uVar148 = (uint)bVar75 * auVar114._20_4_ | (uint)!bVar75 * auVar95._20_4_;
            bVar75 = (bool)((byte)(uVar20 >> 6) & 1);
            uVar149 = (uint)bVar75 * auVar114._24_4_ | (uint)!bVar75 * auVar95._24_4_;
            bVar75 = SUB81(uVar20 >> 7,0);
            uVar150 = (uint)bVar75 * auVar114._28_4_ | (uint)!bVar75 * auVar95._28_4_;
            auVar139._0_4_ = (bVar71 & 1) * uVar77 | !(bool)(bVar71 & 1) * auVar139._0_4_;
            bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar139._4_4_ = bVar75 * uVar144 | !bVar75 * auVar139._4_4_;
            bVar75 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar139._8_4_ = bVar75 * uVar145 | !bVar75 * auVar139._8_4_;
            bVar75 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar139._12_4_ = bVar75 * uVar146 | !bVar75 * auVar139._12_4_;
            bVar75 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar139._16_4_ = bVar75 * uVar147 | !bVar75 * auVar139._16_4_;
            bVar75 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar139._20_4_ = bVar75 * uVar148 | !bVar75 * auVar139._20_4_;
            bVar75 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar139._24_4_ = bVar75 * uVar149 | !bVar75 * auVar139._24_4_;
            bVar75 = SUB81(uVar76 >> 7,0);
            auVar139._28_4_ = bVar75 * uVar150 | !bVar75 * auVar139._28_4_;
            auVar114 = vblendmps_avx512vl(auVar270,auVar258);
            bVar75 = (bool)((byte)(uVar20 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar20 >> 2) & 1);
            bVar13 = (bool)((byte)(uVar20 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar20 >> 4) & 1);
            bVar15 = (bool)((byte)(uVar20 >> 5) & 1);
            bVar16 = (bool)((byte)(uVar20 >> 6) & 1);
            bVar17 = SUB81(uVar20 >> 7,0);
            auVar140._0_4_ =
                 (uint)(bVar71 & 1) *
                 ((uint)(bVar66 & 1) * auVar114._0_4_ | !(bool)(bVar66 & 1) * uVar77) |
                 !(bool)(bVar71 & 1) * auVar140._0_4_;
            bVar11 = (bool)((byte)(uVar76 >> 1) & 1);
            auVar140._4_4_ =
                 (uint)bVar11 * ((uint)bVar75 * auVar114._4_4_ | !bVar75 * uVar144) |
                 !bVar11 * auVar140._4_4_;
            bVar75 = (bool)((byte)(uVar76 >> 2) & 1);
            auVar140._8_4_ =
                 (uint)bVar75 * ((uint)bVar12 * auVar114._8_4_ | !bVar12 * uVar145) |
                 !bVar75 * auVar140._8_4_;
            bVar75 = (bool)((byte)(uVar76 >> 3) & 1);
            auVar140._12_4_ =
                 (uint)bVar75 * ((uint)bVar13 * auVar114._12_4_ | !bVar13 * uVar146) |
                 !bVar75 * auVar140._12_4_;
            bVar75 = (bool)((byte)(uVar76 >> 4) & 1);
            auVar140._16_4_ =
                 (uint)bVar75 * ((uint)bVar14 * auVar114._16_4_ | !bVar14 * uVar147) |
                 !bVar75 * auVar140._16_4_;
            bVar75 = (bool)((byte)(uVar76 >> 5) & 1);
            auVar140._20_4_ =
                 (uint)bVar75 * ((uint)bVar15 * auVar114._20_4_ | !bVar15 * uVar148) |
                 !bVar75 * auVar140._20_4_;
            bVar75 = (bool)((byte)(uVar76 >> 6) & 1);
            auVar140._24_4_ =
                 (uint)bVar75 * ((uint)bVar16 * auVar114._24_4_ | !bVar16 * uVar149) |
                 !bVar75 * auVar140._24_4_;
            bVar75 = SUB81(uVar76 >> 7,0);
            auVar140._28_4_ =
                 (uint)bVar75 * ((uint)bVar17 * auVar114._28_4_ | !bVar17 * uVar150) |
                 !bVar75 * auVar140._28_4_;
            bVar72 = (~bVar71 | bVar66) & bVar72;
          }
        }
        auVar114 = vmovdqa64_avx512vl(auVar110);
        auVar274 = ZEXT3264(auVar114);
        auVar114 = vmulps_avx512vl(local_5e0,auVar94);
        auVar114 = vfmadd231ps_avx512vl(auVar114,local_4a0,auVar93);
        auVar259 = ZEXT3264(local_4a0);
        auVar114 = vfmadd231ps_avx512vl(auVar114,local_5c0,auVar102);
        auVar266 = ZEXT3264(local_5a0);
        _local_200 = local_5a0;
        local_1e0 = vminps_avx(local_340,auVar139);
        auVar252._8_4_ = 0x7fffffff;
        auVar252._0_8_ = 0x7fffffff7fffffff;
        auVar252._12_4_ = 0x7fffffff;
        auVar252._16_4_ = 0x7fffffff;
        auVar252._20_4_ = 0x7fffffff;
        auVar252._24_4_ = 0x7fffffff;
        auVar252._28_4_ = 0x7fffffff;
        auVar114 = vandps_avx(auVar114,auVar252);
        auVar249 = ZEXT3264(auVar252);
        _local_580 = vmaxps_avx(local_5a0,auVar140);
        _local_360 = _local_580;
        auVar253._8_4_ = 0x3e99999a;
        auVar253._0_8_ = 0x3e99999a3e99999a;
        auVar253._12_4_ = 0x3e99999a;
        auVar253._16_4_ = 0x3e99999a;
        auVar253._20_4_ = 0x3e99999a;
        auVar253._24_4_ = 0x3e99999a;
        auVar253._28_4_ = 0x3e99999a;
        auVar254 = ZEXT3264(auVar253);
        uVar19 = vcmpps_avx512vl(auVar114,auVar253,1);
        uVar22 = vcmpps_avx512vl(local_5a0,local_1e0,2);
        bVar71 = (byte)uVar22 & bVar65;
        uVar21 = vcmpps_avx512vl(_local_580,local_340,2);
        if ((bVar65 & ((byte)uVar21 | (byte)uVar22)) == 0) {
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar275 = ZEXT3264(auVar114);
        }
        else {
          bVar66 = (byte)uVar19 | ~bVar72;
          auVar114 = vmulps_avx512vl(local_5e0,auVar264._0_32_);
          auVar81 = vfmadd213ps_fma(auVar96,local_4a0,auVar114);
          auVar114 = vfmadd213ps_avx512vl(auVar92,local_5c0,ZEXT1632(auVar81));
          auVar114 = vandps_avx(auVar114,auVar252);
          uVar19 = vcmpps_avx512vl(auVar114,auVar253,1);
          bVar72 = (byte)uVar19 | ~bVar72;
          auVar162._8_4_ = 2;
          auVar162._0_8_ = 0x200000002;
          auVar162._12_4_ = 2;
          auVar162._16_4_ = 2;
          auVar162._20_4_ = 2;
          auVar162._24_4_ = 2;
          auVar162._28_4_ = 2;
          auVar33._8_4_ = 3;
          auVar33._0_8_ = 0x300000003;
          auVar33._12_4_ = 3;
          auVar33._16_4_ = 3;
          auVar33._20_4_ = 3;
          auVar33._24_4_ = 3;
          auVar33._28_4_ = 3;
          auVar114 = vpblendmd_avx512vl(auVar162,auVar33);
          local_320._0_4_ = (uint)(bVar72 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar72 & 1) * 2;
          bVar75 = (bool)(bVar72 >> 1 & 1);
          local_320._4_4_ = (uint)bVar75 * auVar114._4_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar72 >> 2 & 1);
          local_320._8_4_ = (uint)bVar75 * auVar114._8_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar72 >> 3 & 1);
          local_320._12_4_ = (uint)bVar75 * auVar114._12_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar72 >> 4 & 1);
          local_320._16_4_ = (uint)bVar75 * auVar114._16_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar72 >> 5 & 1);
          local_320._20_4_ = (uint)bVar75 * auVar114._20_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar72 >> 6 & 1);
          local_320._24_4_ = (uint)bVar75 * auVar114._24_4_ | (uint)!bVar75 * 2;
          local_320._28_4_ = (uint)(bVar72 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar72 >> 7) * 2;
          local_500 = vpbroadcastd_avx512vl();
          uVar19 = vpcmpd_avx512vl(local_500,local_320,5);
          local_560 = local_5a0._0_4_ + (float)local_760._0_4_;
          fStack_55c = local_5a0._4_4_ + (float)local_760._4_4_;
          fStack_558 = local_5a0._8_4_ + fStack_758;
          fStack_554 = local_5a0._12_4_ + fStack_754;
          fStack_550 = local_5a0._16_4_ + fStack_750;
          fStack_54c = local_5a0._20_4_ + fStack_74c;
          fStack_548 = local_5a0._24_4_ + fStack_748;
          fStack_544 = local_5a0._28_4_ + fStack_744;
          for (bVar72 = (byte)uVar19 & bVar71; bVar72 != 0;
              bVar72 = ~('\x01' << ((byte)iVar23 & 0x1f)) & bVar72 & (byte)uVar19) {
            auVar163._8_4_ = 0x7f800000;
            auVar163._0_8_ = 0x7f8000007f800000;
            auVar163._12_4_ = 0x7f800000;
            auVar163._16_4_ = 0x7f800000;
            auVar163._20_4_ = 0x7f800000;
            auVar163._24_4_ = 0x7f800000;
            auVar163._28_4_ = 0x7f800000;
            auVar114 = vblendmps_avx512vl(auVar163,local_5a0);
            auVar141._0_4_ =
                 (uint)(bVar72 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar72 & 1) * 0x7f800000;
            bVar75 = (bool)(bVar72 >> 1 & 1);
            auVar141._4_4_ = (uint)bVar75 * auVar114._4_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar72 >> 2 & 1);
            auVar141._8_4_ = (uint)bVar75 * auVar114._8_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar72 >> 3 & 1);
            auVar141._12_4_ = (uint)bVar75 * auVar114._12_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar72 >> 4 & 1);
            auVar141._16_4_ = (uint)bVar75 * auVar114._16_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar72 >> 5 & 1);
            auVar141._20_4_ = (uint)bVar75 * auVar114._20_4_ | (uint)!bVar75 * 0x7f800000;
            auVar141._24_4_ =
                 (uint)(bVar72 >> 6) * auVar114._24_4_ | (uint)!(bool)(bVar72 >> 6) * 0x7f800000;
            auVar141._28_4_ = 0x7f800000;
            auVar114 = vshufps_avx(auVar141,auVar141,0xb1);
            auVar114 = vminps_avx(auVar141,auVar114);
            auVar92 = vshufpd_avx(auVar114,auVar114,5);
            auVar114 = vminps_avx(auVar114,auVar92);
            auVar92 = vpermpd_avx2(auVar114,0x4e);
            auVar114 = vminps_avx(auVar114,auVar92);
            uVar19 = vcmpps_avx512vl(auVar141,auVar114,0);
            bVar67 = (byte)uVar19 & bVar72;
            bVar68 = bVar72;
            if (bVar67 != 0) {
              bVar68 = bVar67;
            }
            iVar23 = 0;
            for (uVar77 = (uint)bVar68; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
              iVar23 = iVar23 + 1;
            }
            uVar77 = *(uint *)(local_200 + (uint)(iVar23 << 2));
            fVar255 = auVar78._0_4_;
            auVar81 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar23 << 2)));
            if ((float)local_800._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar23 << 2)));
              auVar259 = ZEXT1664(auVar259._0_16_);
              auVar264 = ZEXT1664(auVar264._0_16_);
              auVar266 = ZEXT1664(auVar266._0_16_);
              auVar271 = ZEXT1664(auVar271._0_16_);
              fVar255 = sqrtf((float)local_800._0_4_);
              auVar114 = vmovdqa64_avx512vl(auVar110);
              auVar274 = ZEXT3264(auVar114);
              auVar81 = local_880._0_16_;
            }
            auVar254 = ZEXT464(uVar77);
            auVar2 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar82 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar91 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar87 = vminps_avx(auVar2,auVar91);
            auVar2 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar91 = vmaxps_avx(auVar82,auVar2);
            auVar208._8_4_ = 0x7fffffff;
            auVar208._0_8_ = 0x7fffffff7fffffff;
            auVar208._12_4_ = 0x7fffffff;
            auVar82 = vandps_avx(auVar87,auVar208);
            auVar2 = vandps_avx(auVar91,auVar208);
            auVar82 = vmaxps_avx(auVar82,auVar2);
            auVar2 = vmovshdup_avx(auVar82);
            auVar2 = vmaxss_avx(auVar2,auVar82);
            auVar82 = vshufpd_avx(auVar82,auVar82,1);
            auVar82 = vmaxss_avx(auVar82,auVar2);
            fVar260 = auVar82._0_4_ * 1.9073486e-06;
            local_850._0_4_ = fVar255 * 1.9073486e-06;
            local_6e0 = vshufps_avx(auVar91,auVar91,0xff);
            auVar81 = vinsertps_avx(ZEXT416(uVar77),auVar81,0x10);
            auVar263 = ZEXT1664(auVar81);
            lVar69 = 5;
            do {
              do {
                bVar75 = lVar69 == 0;
                lVar69 = lVar69 + -1;
                if (bVar75) goto LAB_01b2d35e;
                uVar174 = auVar263._0_4_;
                auVar153._4_4_ = uVar174;
                auVar153._0_4_ = uVar174;
                auVar153._8_4_ = uVar174;
                auVar153._12_4_ = uVar174;
                auVar81 = vfmadd132ps_fma(auVar153,ZEXT816(0) << 0x40,local_7f0);
                local_740 = auVar263._0_32_;
                auVar82 = vmovshdup_avx(auVar263._0_16_);
                fVar225 = auVar82._0_4_;
                fVar239 = 1.0 - fVar225;
                fVar262 = fVar239 * fVar239 * fVar239;
                fVar255 = fVar225 * fVar225;
                fVar227 = fVar225 * fVar255;
                auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar262),
                                         ZEXT416((uint)fVar227));
                fVar261 = fVar225 * fVar239;
                auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar225 * fVar261 * 6.0)),
                                          ZEXT416((uint)(fVar239 * fVar261)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar227),
                                          ZEXT416((uint)fVar262));
                auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * fVar261 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar225 * fVar261)));
                fVar262 = fVar262 * 0.16666667;
                fVar225 = (auVar2._0_4_ + auVar87._0_4_) * 0.16666667;
                fVar226 = (auVar91._0_4_ + auVar80._0_4_) * 0.16666667;
                fVar227 = fVar227 * 0.16666667;
                auVar191._0_4_ = fVar227 * (float)local_7e0._0_4_;
                auVar191._4_4_ = fVar227 * (float)local_7e0._4_4_;
                auVar191._8_4_ = fVar227 * fStack_7d8;
                auVar191._12_4_ = fVar227 * fStack_7d4;
                auVar230._4_4_ = fVar226;
                auVar230._0_4_ = fVar226;
                auVar230._8_4_ = fVar226;
                auVar230._12_4_ = fVar226;
                auVar2 = vfmadd132ps_fma(auVar230,auVar191,local_7a0._0_16_);
                auVar192._4_4_ = fVar225;
                auVar192._0_4_ = fVar225;
                auVar192._8_4_ = fVar225;
                auVar192._12_4_ = fVar225;
                auVar2 = vfmadd132ps_fma(auVar192,auVar2,local_7c0._0_16_);
                auVar175._4_4_ = fVar262;
                auVar175._0_4_ = fVar262;
                auVar175._8_4_ = fVar262;
                auVar175._12_4_ = fVar262;
                auVar2 = vfmadd132ps_fma(auVar175,auVar2,local_780._0_16_);
                local_600._0_16_ = auVar2;
                auVar2 = vsubps_avx(auVar81,auVar2);
                auVar81 = vdpps_avx(auVar2,auVar2,0x7f);
                local_820._0_16_ = auVar81;
                local_880._0_16_ = ZEXT416((uint)fVar239);
                if (auVar81._0_4_ < 0.0) {
                  local_8a0._0_4_ = fVar255;
                  local_8c0._0_4_ = fVar261;
                  auVar245._0_4_ = sqrtf(auVar81._0_4_);
                  auVar245._4_60_ = extraout_var;
                  auVar81 = auVar245._0_16_;
                  fVar261 = (float)local_8c0._0_4_;
                  auVar91 = local_880._0_16_;
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  local_8a0._0_4_ = fVar255;
                  auVar91 = ZEXT416((uint)fVar239);
                }
                local_620._4_4_ = auVar91._0_4_;
                local_620._0_4_ = local_620._4_4_;
                fStack_618 = (float)local_620._4_4_;
                fStack_614 = (float)local_620._4_4_;
                auVar87 = vfnmsub213ss_fma(auVar82,auVar82,ZEXT416((uint)(fVar261 * 4.0)));
                auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar261 * 4.0)),auVar91,auVar91);
                fVar255 = (float)local_620._4_4_ * -(float)local_620._4_4_ * 0.5;
                fVar261 = auVar87._0_4_ * 0.5;
                fVar262 = auVar91._0_4_ * 0.5;
                local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
                auVar209._0_4_ = (float)local_8a0._0_4_ * (float)local_7e0._0_4_;
                auVar209._4_4_ = (float)local_8a0._0_4_ * (float)local_7e0._4_4_;
                auVar209._8_4_ = (float)local_8a0._0_4_ * fStack_7d8;
                auVar209._12_4_ = (float)local_8a0._0_4_ * fStack_7d4;
                auVar176._4_4_ = fVar262;
                auVar176._0_4_ = fVar262;
                auVar176._8_4_ = fVar262;
                auVar176._12_4_ = fVar262;
                auVar91 = vfmadd132ps_fma(auVar176,auVar209,local_7a0._0_16_);
                auVar193._4_4_ = fVar261;
                auVar193._0_4_ = fVar261;
                auVar193._8_4_ = fVar261;
                auVar193._12_4_ = fVar261;
                auVar91 = vfmadd132ps_fma(auVar193,auVar91,local_7c0._0_16_);
                auVar267._4_4_ = fVar255;
                auVar267._0_4_ = fVar255;
                auVar267._8_4_ = fVar255;
                auVar267._12_4_ = fVar255;
                _local_8a0 = vfmadd132ps_fma(auVar267,auVar91,local_780._0_16_);
                local_640._0_16_ = vdpps_avx(_local_8a0,_local_8a0,0x7f);
                auVar52._12_4_ = 0;
                auVar52._0_12_ = ZEXT812(0);
                fVar255 = local_640._0_4_;
                local_840 = vrsqrt14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar255));
                fVar261 = local_840._0_4_;
                local_660._0_16_ = vrcp14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar255));
                auVar91 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,ZEXT416(0x40000000));
                local_680._0_4_ = auVar91._0_4_;
                local_8c0._0_4_ = auVar81._0_4_;
                if (fVar255 < -fVar255) {
                  fVar262 = sqrtf(fVar255);
                  auVar81 = ZEXT416((uint)local_8c0._0_4_);
                  auVar91 = _local_8a0;
                }
                else {
                  auVar91 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
                  fVar262 = auVar91._0_4_;
                  auVar91 = _local_8a0;
                }
                fVar225 = local_840._0_4_;
                fVar255 = fVar261 * 1.5 + fVar255 * -0.5 * fVar225 * fVar225 * fVar225;
                local_840._0_4_ = auVar91._0_4_ * fVar255;
                local_840._4_4_ = auVar91._4_4_ * fVar255;
                local_840._8_4_ = auVar91._8_4_ * fVar255;
                local_840._12_4_ = auVar91._12_4_ * fVar255;
                auVar87 = vdpps_avx(auVar2,local_840,0x7f);
                fVar226 = auVar81._0_4_;
                fVar261 = auVar87._0_4_;
                auVar154._0_4_ = fVar261 * fVar261;
                auVar154._4_4_ = auVar87._4_4_ * auVar87._4_4_;
                auVar154._8_4_ = auVar87._8_4_ * auVar87._8_4_;
                auVar154._12_4_ = auVar87._12_4_ * auVar87._12_4_;
                auVar80 = vsubps_avx(local_820._0_16_,auVar154);
                fVar225 = auVar80._0_4_;
                auVar177._4_12_ = ZEXT812(0) << 0x20;
                auVar177._0_4_ = fVar225;
                auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
                auVar84 = vmulss_avx512f(auVar83,ZEXT416(0x3fc00000));
                auVar85 = vmulss_avx512f(auVar80,ZEXT416(0xbf000000));
                if (fVar225 < 0.0) {
                  local_6a0._0_4_ = fVar262;
                  local_6c0._0_4_ = auVar84._0_4_;
                  local_6d0._4_4_ = fVar255;
                  local_6d0._0_4_ = fVar255;
                  fStack_6c8 = fVar255;
                  fStack_6c4 = fVar255;
                  local_6b0 = auVar83;
                  fVar225 = sqrtf(fVar225);
                  auVar85 = ZEXT416(auVar85._0_4_);
                  auVar84 = ZEXT416((uint)local_6c0._0_4_);
                  auVar81 = ZEXT416((uint)local_8c0._0_4_);
                  auVar83 = local_6b0;
                  auVar91 = _local_8a0;
                  fVar255 = (float)local_6d0._0_4_;
                  fVar227 = (float)local_6d0._4_4_;
                  fVar239 = fStack_6c8;
                  fVar228 = fStack_6c4;
                  fVar262 = (float)local_6a0._0_4_;
                }
                else {
                  auVar80 = vsqrtss_avx(auVar80,auVar80);
                  fVar225 = auVar80._0_4_;
                  fVar227 = fVar255;
                  fVar239 = fVar255;
                  fVar228 = fVar255;
                }
                auVar271 = ZEXT1664(auVar91);
                auVar266 = ZEXT1664(local_820._0_16_);
                auVar264 = ZEXT1664(auVar2);
                auVar114 = vmovdqa64_avx512vl(auVar110);
                auVar274 = ZEXT3264(auVar114);
                auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_,auVar82);
                auVar88 = vfmadd213ss_fma(auVar82,SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_);
                auVar90 = local_740._0_16_;
                auVar82 = vshufps_avx(auVar90,auVar90,0x55);
                auVar194._0_4_ = auVar82._0_4_ * (float)local_7e0._0_4_;
                auVar194._4_4_ = auVar82._4_4_ * (float)local_7e0._4_4_;
                auVar194._8_4_ = auVar82._8_4_ * fStack_7d8;
                auVar194._12_4_ = auVar82._12_4_ * fStack_7d4;
                auVar210._0_4_ = auVar88._0_4_;
                auVar210._4_4_ = auVar210._0_4_;
                auVar210._8_4_ = auVar210._0_4_;
                auVar210._12_4_ = auVar210._0_4_;
                auVar82 = vfmadd132ps_fma(auVar210,auVar194,local_7a0._0_16_);
                auVar178._0_4_ = auVar80._0_4_;
                auVar178._4_4_ = auVar178._0_4_;
                auVar178._8_4_ = auVar178._0_4_;
                auVar178._12_4_ = auVar178._0_4_;
                auVar82 = vfmadd132ps_fma(auVar178,auVar82,local_7c0._0_16_);
                auVar82 = vfmadd132ps_fma(_local_620,auVar82,local_780._0_16_);
                auVar179._0_4_ = auVar82._0_4_ * (float)local_640._0_4_;
                auVar179._4_4_ = auVar82._4_4_ * (float)local_640._0_4_;
                auVar179._8_4_ = auVar82._8_4_ * (float)local_640._0_4_;
                auVar179._12_4_ = auVar82._12_4_ * (float)local_640._0_4_;
                auVar82 = vdpps_avx(auVar91,auVar82,0x7f);
                fVar236 = auVar82._0_4_;
                auVar195._0_4_ = auVar91._0_4_ * fVar236;
                auVar195._4_4_ = auVar91._4_4_ * fVar236;
                auVar195._8_4_ = auVar91._8_4_ * fVar236;
                auVar195._12_4_ = auVar91._12_4_ * fVar236;
                auVar82 = vsubps_avx(auVar179,auVar195);
                fVar236 = (float)local_680._0_4_ * (float)local_660._0_4_;
                auVar88 = vmaxss_avx(ZEXT416((uint)fVar260),
                                     ZEXT416((uint)(local_740._0_4_ * (float)local_850._0_4_)));
                auVar24._8_4_ = 0x80000000;
                auVar24._0_8_ = 0x8000000080000000;
                auVar24._12_4_ = 0x80000000;
                auVar86 = vxorps_avx512vl(auVar91,auVar24);
                auVar196._0_4_ = fVar255 * auVar82._0_4_ * fVar236;
                auVar196._4_4_ = fVar227 * auVar82._4_4_ * fVar236;
                auVar196._8_4_ = fVar239 * auVar82._8_4_ * fVar236;
                auVar196._12_4_ = fVar228 * auVar82._12_4_ * fVar236;
                auVar82 = vdpps_avx(auVar86,local_840,0x7f);
                auVar80 = vfmadd213ss_fma(auVar81,ZEXT416((uint)fVar260),auVar88);
                auVar81 = vdpps_avx(auVar2,auVar196,0x7f);
                auVar89 = vfmadd213ss_fma(ZEXT416((uint)(fVar226 + 1.0)),
                                          ZEXT416((uint)(fVar260 / fVar262)),auVar80);
                fVar255 = auVar82._0_4_ + auVar81._0_4_;
                auVar81 = vdpps_avx(local_7f0,local_840,0x7f);
                auVar82 = vdpps_avx(auVar2,auVar86,0x7f);
                auVar80 = vmulss_avx512f(auVar85,auVar83);
                auVar85 = vaddss_avx512f(auVar84,ZEXT416((uint)(auVar80._0_4_ *
                                                               auVar83._0_4_ * auVar83._0_4_)));
                auVar80 = vdpps_avx(auVar2,local_7f0,0x7f);
                auVar84 = vfnmadd231ss_fma(auVar82,auVar87,ZEXT416((uint)fVar255));
                auVar80 = vfnmadd231ss_fma(auVar80,auVar87,auVar81);
                auVar82 = vpermilps_avx(local_600._0_16_,0xff);
                fVar225 = fVar225 - auVar82._0_4_;
                auVar83 = vshufps_avx(auVar91,auVar91,0xff);
                auVar82 = vfmsub213ss_fma(auVar84,auVar85,auVar83);
                auVar256._8_4_ = 0x80000000;
                auVar256._0_8_ = 0x8000000080000000;
                auVar256._12_4_ = 0x80000000;
                auVar259 = ZEXT1664(auVar256);
                auVar250._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
                auVar250._8_4_ = auVar82._8_4_ ^ 0x80000000;
                auVar250._12_4_ = auVar82._12_4_ ^ 0x80000000;
                auVar254 = ZEXT1664(auVar250);
                auVar80 = ZEXT416((uint)(auVar80._0_4_ * auVar85._0_4_));
                auVar84 = vfmsub231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar82._0_4_)),
                                          ZEXT416((uint)fVar255),auVar80);
                auVar82 = vinsertps_avx(auVar250,auVar80,0x1c);
                auVar241._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
                auVar241._8_4_ = auVar81._8_4_ ^ 0x80000000;
                auVar241._12_4_ = auVar81._12_4_ ^ 0x80000000;
                auVar80 = vinsertps_avx(ZEXT416((uint)fVar255),auVar241,0x10);
                auVar211._0_4_ = auVar84._0_4_;
                auVar211._4_4_ = auVar211._0_4_;
                auVar211._8_4_ = auVar211._0_4_;
                auVar211._12_4_ = auVar211._0_4_;
                auVar81 = vdivps_avx(auVar82,auVar211);
                auVar82 = vdivps_avx(auVar80,auVar211);
                auVar212._0_4_ = fVar261 * auVar81._0_4_ + fVar225 * auVar82._0_4_;
                auVar212._4_4_ = fVar261 * auVar81._4_4_ + fVar225 * auVar82._4_4_;
                auVar212._8_4_ = fVar261 * auVar81._8_4_ + fVar225 * auVar82._8_4_;
                auVar212._12_4_ = fVar261 * auVar81._12_4_ + fVar225 * auVar82._12_4_;
                auVar81 = vsubps_avx(auVar90,auVar212);
                auVar263 = ZEXT1664(auVar81);
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar82 = vandps_avx512vl(auVar87,auVar25);
              } while (auVar89._0_4_ <= auVar82._0_4_);
              auVar82 = vfmadd231ss_fma(ZEXT416((uint)(auVar89._0_4_ + auVar88._0_4_)),local_6e0,
                                        ZEXT416(0x36000000));
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar87 = vandps_avx512vl(ZEXT416((uint)fVar225),auVar26);
            } while (auVar82._0_4_ <= auVar87._0_4_);
            fVar255 = auVar81._0_4_ + (float)local_6f0._0_4_;
            if ((fVar18 <= fVar255) &&
               (fVar260 = *(float *)(ray + k * 4 + 0x100), fVar255 <= fVar260)) {
              auVar82 = vmovshdup_avx(auVar81);
              fVar261 = auVar82._0_4_;
              if ((0.0 <= fVar261) && (fVar261 <= 1.0)) {
                auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_820._0_4_));
                fVar262 = auVar82._0_4_;
                pGVar5 = (context->scene->geometries).items[uVar3].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar262 = fVar262 * 1.5 + local_820._0_4_ * -0.5 * fVar262 * fVar262 * fVar262;
                  auVar213._0_4_ = auVar2._0_4_ * fVar262;
                  auVar213._4_4_ = auVar2._4_4_ * fVar262;
                  auVar213._8_4_ = auVar2._8_4_ * fVar262;
                  auVar213._12_4_ = auVar2._12_4_ * fVar262;
                  auVar83 = vfmadd213ps_fma(auVar83,auVar213,auVar91);
                  auVar82 = vshufps_avx(auVar213,auVar213,0xc9);
                  auVar87 = vshufps_avx(auVar91,auVar91,0xc9);
                  auVar214._0_4_ = auVar213._0_4_ * auVar87._0_4_;
                  auVar214._4_4_ = auVar213._4_4_ * auVar87._4_4_;
                  auVar214._8_4_ = auVar213._8_4_ * auVar87._8_4_;
                  auVar214._12_4_ = auVar213._12_4_ * auVar87._12_4_;
                  auVar80 = vfmsub231ps_fma(auVar214,auVar91,auVar82);
                  auVar82 = vshufps_avx(auVar80,auVar80,0xc9);
                  auVar87 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar80 = vshufps_avx(auVar80,auVar80,0xd2);
                  auVar155._0_4_ = auVar83._0_4_ * auVar80._0_4_;
                  auVar155._4_4_ = auVar83._4_4_ * auVar80._4_4_;
                  auVar155._8_4_ = auVar83._8_4_ * auVar80._8_4_;
                  auVar155._12_4_ = auVar83._12_4_ * auVar80._12_4_;
                  auVar82 = vfmsub231ps_fma(auVar155,auVar82,auVar87);
                  uVar174 = auVar82._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar255;
                    uVar4 = vextractps_avx(auVar82,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                    uVar4 = vextractps_avx(auVar82,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar174;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar261;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_828;
                    *(uint *)(ray + k * 4 + 0x240) = uVar3;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar9 = context->user;
                    auVar222._8_4_ = 1;
                    auVar222._0_8_ = 0x100000001;
                    auVar222._12_4_ = 1;
                    auVar222._16_4_ = 1;
                    auVar222._20_4_ = 1;
                    auVar222._24_4_ = 1;
                    auVar222._28_4_ = 1;
                    local_420 = vpermps_avx2(auVar222,ZEXT1632(auVar81));
                    auVar114 = vpermps_avx2(auVar222,ZEXT1632(auVar82));
                    auVar234._8_4_ = 2;
                    auVar234._0_8_ = 0x200000002;
                    auVar234._12_4_ = 2;
                    auVar234._16_4_ = 2;
                    auVar234._20_4_ = 2;
                    auVar234._24_4_ = 2;
                    auVar234._28_4_ = 2;
                    local_460 = vpermps_avx2(auVar234,ZEXT1632(auVar82));
                    local_480[0] = (RTCHitN)auVar114[0];
                    local_480[1] = (RTCHitN)auVar114[1];
                    local_480[2] = (RTCHitN)auVar114[2];
                    local_480[3] = (RTCHitN)auVar114[3];
                    local_480[4] = (RTCHitN)auVar114[4];
                    local_480[5] = (RTCHitN)auVar114[5];
                    local_480[6] = (RTCHitN)auVar114[6];
                    local_480[7] = (RTCHitN)auVar114[7];
                    local_480[8] = (RTCHitN)auVar114[8];
                    local_480[9] = (RTCHitN)auVar114[9];
                    local_480[10] = (RTCHitN)auVar114[10];
                    local_480[0xb] = (RTCHitN)auVar114[0xb];
                    local_480[0xc] = (RTCHitN)auVar114[0xc];
                    local_480[0xd] = (RTCHitN)auVar114[0xd];
                    local_480[0xe] = (RTCHitN)auVar114[0xe];
                    local_480[0xf] = (RTCHitN)auVar114[0xf];
                    local_480[0x10] = (RTCHitN)auVar114[0x10];
                    local_480[0x11] = (RTCHitN)auVar114[0x11];
                    local_480[0x12] = (RTCHitN)auVar114[0x12];
                    local_480[0x13] = (RTCHitN)auVar114[0x13];
                    local_480[0x14] = (RTCHitN)auVar114[0x14];
                    local_480[0x15] = (RTCHitN)auVar114[0x15];
                    local_480[0x16] = (RTCHitN)auVar114[0x16];
                    local_480[0x17] = (RTCHitN)auVar114[0x17];
                    local_480[0x18] = (RTCHitN)auVar114[0x18];
                    local_480[0x19] = (RTCHitN)auVar114[0x19];
                    local_480[0x1a] = (RTCHitN)auVar114[0x1a];
                    local_480[0x1b] = (RTCHitN)auVar114[0x1b];
                    local_480[0x1c] = (RTCHitN)auVar114[0x1c];
                    local_480[0x1d] = (RTCHitN)auVar114[0x1d];
                    local_480[0x1e] = (RTCHitN)auVar114[0x1e];
                    local_480[0x1f] = (RTCHitN)auVar114[0x1f];
                    local_440 = uVar174;
                    uStack_43c = uVar174;
                    uStack_438 = uVar174;
                    uStack_434 = uVar174;
                    uStack_430 = uVar174;
                    uStack_42c = uVar174;
                    uStack_428 = uVar174;
                    uStack_424 = uVar174;
                    local_400 = ZEXT432(0) << 0x20;
                    local_3e0 = local_4e0._0_8_;
                    uStack_3d8 = local_4e0._8_8_;
                    uStack_3d0 = local_4e0._16_8_;
                    uStack_3c8 = local_4e0._24_8_;
                    local_3c0 = local_4c0;
                    auVar114 = vpcmpeqd_avx2(local_4c0,local_4c0);
                    local_830[1] = auVar114;
                    *local_830 = auVar114;
                    local_3a0 = pRVar9->instID[0];
                    uStack_39c = local_3a0;
                    uStack_398 = local_3a0;
                    uStack_394 = local_3a0;
                    uStack_390 = local_3a0;
                    uStack_38c = local_3a0;
                    uStack_388 = local_3a0;
                    uStack_384 = local_3a0;
                    local_380 = pRVar9->instPrimID[0];
                    uStack_37c = local_380;
                    uStack_378 = local_380;
                    uStack_374 = local_380;
                    uStack_370 = local_380;
                    uStack_36c = local_380;
                    uStack_368 = local_380;
                    uStack_364 = local_380;
                    *(float *)(ray + k * 4 + 0x100) = fVar255;
                    local_720 = local_520;
                    local_8f0.valid = (int *)local_720;
                    local_8f0.geometryUserPtr = pGVar5->userPtr;
                    local_8f0.context = context->user;
                    local_8f0.hit = local_480;
                    local_8f0.N = 8;
                    local_8f0.ray = (RTCRayN *)ray;
                    if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar254 = ZEXT1664(auVar250);
                      auVar259 = ZEXT1664(auVar256);
                      auVar263 = ZEXT1664(auVar81);
                      auVar264 = ZEXT1664(auVar2);
                      auVar266 = ZEXT1664(local_820._0_16_);
                      auVar271 = ZEXT1664(auVar91);
                      (*pGVar5->intersectionFilterN)(&local_8f0);
                      auVar114 = vmovdqa64_avx512vl(auVar110);
                      auVar274 = ZEXT3264(auVar114);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar254 = ZEXT1664(auVar254._0_16_);
                        auVar259 = ZEXT1664(auVar259._0_16_);
                        auVar263 = ZEXT1664(auVar263._0_16_);
                        auVar264 = ZEXT1664(auVar264._0_16_);
                        auVar266 = ZEXT1664(auVar266._0_16_);
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        (*p_Var10)(&local_8f0);
                        auVar114 = vmovdqa64_avx512vl(auVar110);
                        auVar274 = ZEXT3264(auVar114);
                      }
                      if (local_720 != (undefined1  [32])0x0) {
                        uVar76 = vptestmd_avx512vl(local_720,local_720);
                        iVar54 = *(int *)(local_8f0.hit + 4);
                        iVar55 = *(int *)(local_8f0.hit + 8);
                        iVar56 = *(int *)(local_8f0.hit + 0xc);
                        iVar57 = *(int *)(local_8f0.hit + 0x10);
                        iVar58 = *(int *)(local_8f0.hit + 0x14);
                        iVar59 = *(int *)(local_8f0.hit + 0x18);
                        iVar60 = *(int *)(local_8f0.hit + 0x1c);
                        bVar68 = (byte)uVar76;
                        bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar16 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_8f0.ray + 0x180) =
                             (uint)(bVar68 & 1) * *(int *)local_8f0.hit |
                             (uint)!(bool)(bVar68 & 1) * *(int *)(local_8f0.ray + 0x180);
                        *(uint *)(local_8f0.ray + 0x184) =
                             (uint)bVar75 * iVar54 | (uint)!bVar75 * *(int *)(local_8f0.ray + 0x184)
                        ;
                        *(uint *)(local_8f0.ray + 0x188) =
                             (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_8f0.ray + 0x188)
                        ;
                        *(uint *)(local_8f0.ray + 0x18c) =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_8f0.ray + 0x18c)
                        ;
                        *(uint *)(local_8f0.ray + 400) =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_8f0.ray + 400);
                        *(uint *)(local_8f0.ray + 0x194) =
                             (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_8f0.ray + 0x194)
                        ;
                        *(uint *)(local_8f0.ray + 0x198) =
                             (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_8f0.ray + 0x198)
                        ;
                        *(uint *)(local_8f0.ray + 0x19c) =
                             (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_8f0.ray + 0x19c)
                        ;
                        iVar54 = *(int *)(local_8f0.hit + 0x24);
                        iVar55 = *(int *)(local_8f0.hit + 0x28);
                        iVar56 = *(int *)(local_8f0.hit + 0x2c);
                        iVar57 = *(int *)(local_8f0.hit + 0x30);
                        iVar58 = *(int *)(local_8f0.hit + 0x34);
                        iVar59 = *(int *)(local_8f0.hit + 0x38);
                        iVar60 = *(int *)(local_8f0.hit + 0x3c);
                        bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar16 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_8f0.ray + 0x1a0) =
                             (uint)(bVar68 & 1) * *(int *)(local_8f0.hit + 0x20) |
                             (uint)!(bool)(bVar68 & 1) * *(int *)(local_8f0.ray + 0x1a0);
                        *(uint *)(local_8f0.ray + 0x1a4) =
                             (uint)bVar75 * iVar54 | (uint)!bVar75 * *(int *)(local_8f0.ray + 0x1a4)
                        ;
                        *(uint *)(local_8f0.ray + 0x1a8) =
                             (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_8f0.ray + 0x1a8)
                        ;
                        *(uint *)(local_8f0.ray + 0x1ac) =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_8f0.ray + 0x1ac)
                        ;
                        *(uint *)(local_8f0.ray + 0x1b0) =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_8f0.ray + 0x1b0)
                        ;
                        *(uint *)(local_8f0.ray + 0x1b4) =
                             (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_8f0.ray + 0x1b4)
                        ;
                        *(uint *)(local_8f0.ray + 0x1b8) =
                             (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_8f0.ray + 0x1b8)
                        ;
                        *(uint *)(local_8f0.ray + 0x1bc) =
                             (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_8f0.ray + 0x1bc)
                        ;
                        iVar54 = *(int *)(local_8f0.hit + 0x44);
                        iVar55 = *(int *)(local_8f0.hit + 0x48);
                        iVar56 = *(int *)(local_8f0.hit + 0x4c);
                        iVar57 = *(int *)(local_8f0.hit + 0x50);
                        iVar58 = *(int *)(local_8f0.hit + 0x54);
                        iVar59 = *(int *)(local_8f0.hit + 0x58);
                        iVar60 = *(int *)(local_8f0.hit + 0x5c);
                        bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar16 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_8f0.ray + 0x1c0) =
                             (uint)(bVar68 & 1) * *(int *)(local_8f0.hit + 0x40) |
                             (uint)!(bool)(bVar68 & 1) * *(int *)(local_8f0.ray + 0x1c0);
                        *(uint *)(local_8f0.ray + 0x1c4) =
                             (uint)bVar75 * iVar54 | (uint)!bVar75 * *(int *)(local_8f0.ray + 0x1c4)
                        ;
                        *(uint *)(local_8f0.ray + 0x1c8) =
                             (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_8f0.ray + 0x1c8)
                        ;
                        *(uint *)(local_8f0.ray + 0x1cc) =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_8f0.ray + 0x1cc)
                        ;
                        *(uint *)(local_8f0.ray + 0x1d0) =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_8f0.ray + 0x1d0)
                        ;
                        *(uint *)(local_8f0.ray + 0x1d4) =
                             (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_8f0.ray + 0x1d4)
                        ;
                        *(uint *)(local_8f0.ray + 0x1d8) =
                             (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_8f0.ray + 0x1d8)
                        ;
                        *(uint *)(local_8f0.ray + 0x1dc) =
                             (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_8f0.ray + 0x1dc)
                        ;
                        iVar54 = *(int *)(local_8f0.hit + 100);
                        iVar55 = *(int *)(local_8f0.hit + 0x68);
                        iVar56 = *(int *)(local_8f0.hit + 0x6c);
                        iVar57 = *(int *)(local_8f0.hit + 0x70);
                        iVar58 = *(int *)(local_8f0.hit + 0x74);
                        iVar59 = *(int *)(local_8f0.hit + 0x78);
                        iVar60 = *(int *)(local_8f0.hit + 0x7c);
                        bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar16 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_8f0.ray + 0x1e0) =
                             (uint)(bVar68 & 1) * *(int *)(local_8f0.hit + 0x60) |
                             (uint)!(bool)(bVar68 & 1) * *(int *)(local_8f0.ray + 0x1e0);
                        *(uint *)(local_8f0.ray + 0x1e4) =
                             (uint)bVar75 * iVar54 | (uint)!bVar75 * *(int *)(local_8f0.ray + 0x1e4)
                        ;
                        *(uint *)(local_8f0.ray + 0x1e8) =
                             (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_8f0.ray + 0x1e8)
                        ;
                        *(uint *)(local_8f0.ray + 0x1ec) =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_8f0.ray + 0x1ec)
                        ;
                        *(uint *)(local_8f0.ray + 0x1f0) =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_8f0.ray + 0x1f0)
                        ;
                        *(uint *)(local_8f0.ray + 500) =
                             (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_8f0.ray + 500);
                        *(uint *)(local_8f0.ray + 0x1f8) =
                             (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_8f0.ray + 0x1f8)
                        ;
                        *(uint *)(local_8f0.ray + 0x1fc) =
                             (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_8f0.ray + 0x1fc)
                        ;
                        iVar54 = *(int *)(local_8f0.hit + 0x84);
                        iVar55 = *(int *)(local_8f0.hit + 0x88);
                        iVar56 = *(int *)(local_8f0.hit + 0x8c);
                        iVar57 = *(int *)(local_8f0.hit + 0x90);
                        iVar58 = *(int *)(local_8f0.hit + 0x94);
                        iVar59 = *(int *)(local_8f0.hit + 0x98);
                        iVar60 = *(int *)(local_8f0.hit + 0x9c);
                        bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar16 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_8f0.ray + 0x200) =
                             (uint)(bVar68 & 1) * *(int *)(local_8f0.hit + 0x80) |
                             (uint)!(bool)(bVar68 & 1) * *(int *)(local_8f0.ray + 0x200);
                        *(uint *)(local_8f0.ray + 0x204) =
                             (uint)bVar75 * iVar54 | (uint)!bVar75 * *(int *)(local_8f0.ray + 0x204)
                        ;
                        *(uint *)(local_8f0.ray + 0x208) =
                             (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_8f0.ray + 0x208)
                        ;
                        *(uint *)(local_8f0.ray + 0x20c) =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_8f0.ray + 0x20c)
                        ;
                        *(uint *)(local_8f0.ray + 0x210) =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_8f0.ray + 0x210)
                        ;
                        *(uint *)(local_8f0.ray + 0x214) =
                             (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_8f0.ray + 0x214)
                        ;
                        *(uint *)(local_8f0.ray + 0x218) =
                             (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_8f0.ray + 0x218)
                        ;
                        *(uint *)(local_8f0.ray + 0x21c) =
                             (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_8f0.ray + 0x21c)
                        ;
                        auVar114 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8f0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_8f0.ray + 0x220) = auVar114;
                        auVar114 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8f0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_8f0.ray + 0x240) = auVar114;
                        auVar114 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8f0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_8f0.ray + 0x260) = auVar114;
                        auVar114 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8f0.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_8f0.ray + 0x280) = auVar114;
                        goto LAB_01b2d35e;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar260;
                  }
                }
              }
            }
LAB_01b2d35e:
            uVar174 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar243._4_4_ = uVar174;
            auVar243._0_4_ = uVar174;
            auVar243._8_4_ = uVar174;
            auVar243._12_4_ = uVar174;
            auVar243._16_4_ = uVar174;
            auVar243._20_4_ = uVar174;
            auVar243._24_4_ = uVar174;
            auVar243._28_4_ = uVar174;
            auVar245 = ZEXT3264(auVar243);
            auVar61._4_4_ = fStack_55c;
            auVar61._0_4_ = local_560;
            auVar61._8_4_ = fStack_558;
            auVar61._12_4_ = fStack_554;
            auVar61._16_4_ = fStack_550;
            auVar61._20_4_ = fStack_54c;
            auVar61._24_4_ = fStack_548;
            auVar61._28_4_ = fStack_544;
            uVar19 = vcmpps_avx512vl(auVar243,auVar61,0xd);
            auVar249 = ZEXT3264(CONCAT428(0x7fffffff,
                                          CONCAT424(0x7fffffff,
                                                    CONCAT420(0x7fffffff,
                                                              CONCAT416(0x7fffffff,
                                                                        CONCAT412(0x7fffffff,
                                                                                  CONCAT48(
                                                  0x7fffffff,0x7fffffff7fffffff)))))));
          }
          auVar164._0_4_ = (float)local_760._0_4_ + (float)local_580._0_4_;
          auVar164._4_4_ = (float)local_760._4_4_ + (float)local_580._4_4_;
          auVar164._8_4_ = fStack_758 + fStack_578;
          auVar164._12_4_ = fStack_754 + fStack_574;
          auVar164._16_4_ = fStack_750 + fStack_570;
          auVar164._20_4_ = fStack_74c + fStack_56c;
          auVar164._24_4_ = fStack_748 + fStack_568;
          auVar164._28_4_ = fStack_744 + fStack_564;
          uVar174 = auVar245._0_4_;
          auVar186._4_4_ = uVar174;
          auVar186._0_4_ = uVar174;
          auVar186._8_4_ = uVar174;
          auVar186._12_4_ = uVar174;
          auVar186._16_4_ = uVar174;
          auVar186._20_4_ = uVar174;
          auVar186._24_4_ = uVar174;
          auVar186._28_4_ = uVar174;
          uVar19 = vcmpps_avx512vl(auVar164,auVar186,2);
          auVar165._8_4_ = 2;
          auVar165._0_8_ = 0x200000002;
          auVar165._12_4_ = 2;
          auVar165._16_4_ = 2;
          auVar165._20_4_ = 2;
          auVar165._24_4_ = 2;
          auVar165._28_4_ = 2;
          auVar34._8_4_ = 3;
          auVar34._0_8_ = 0x300000003;
          auVar34._12_4_ = 3;
          auVar34._16_4_ = 3;
          auVar34._20_4_ = 3;
          auVar34._24_4_ = 3;
          auVar34._28_4_ = 3;
          auVar114 = vpblendmd_avx512vl(auVar165,auVar34);
          local_580._0_4_ = (uint)(bVar66 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar66 & 1) * 2;
          bVar75 = (bool)(bVar66 >> 1 & 1);
          local_580._4_4_ = (uint)bVar75 * auVar114._4_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar66 >> 2 & 1);
          fStack_578 = (float)((uint)bVar75 * auVar114._8_4_ | (uint)!bVar75 * 2);
          bVar75 = (bool)(bVar66 >> 3 & 1);
          fStack_574 = (float)((uint)bVar75 * auVar114._12_4_ | (uint)!bVar75 * 2);
          bVar75 = (bool)(bVar66 >> 4 & 1);
          fStack_570 = (float)((uint)bVar75 * auVar114._16_4_ | (uint)!bVar75 * 2);
          bVar75 = (bool)(bVar66 >> 5 & 1);
          fStack_56c = (float)((uint)bVar75 * auVar114._20_4_ | (uint)!bVar75 * 2);
          bVar75 = (bool)(bVar66 >> 6 & 1);
          fStack_568 = (float)((uint)bVar75 * auVar114._24_4_ | (uint)!bVar75 * 2);
          fStack_564 = (float)((uint)(bVar66 >> 7) * auVar114._28_4_ |
                              (uint)!(bool)(bVar66 >> 7) * 2);
          bVar65 = (byte)uVar21 & bVar65 & (byte)uVar19;
          uVar19 = vpcmpd_avx512vl(_local_580,local_500,2);
          local_5a0 = _local_360;
          local_560 = (float)local_760._0_4_ + (float)local_360._0_4_;
          fStack_55c = (float)local_760._4_4_ + (float)local_360._4_4_;
          fStack_558 = fStack_758 + fStack_358;
          fStack_554 = fStack_754 + fStack_354;
          fStack_550 = fStack_750 + fStack_350;
          fStack_54c = fStack_74c + fStack_34c;
          fStack_548 = fStack_748 + fStack_348;
          fStack_544 = fStack_744 + fStack_344;
          for (bVar72 = (byte)uVar19 & bVar65; bVar72 != 0;
              bVar72 = ~('\x01' << ((byte)iVar23 & 0x1f)) & bVar72 & (byte)uVar19) {
            auVar166._8_4_ = 0x7f800000;
            auVar166._0_8_ = 0x7f8000007f800000;
            auVar166._12_4_ = 0x7f800000;
            auVar166._16_4_ = 0x7f800000;
            auVar166._20_4_ = 0x7f800000;
            auVar166._24_4_ = 0x7f800000;
            auVar166._28_4_ = 0x7f800000;
            auVar114 = vblendmps_avx512vl(auVar166,local_5a0);
            auVar142._0_4_ =
                 (uint)(bVar72 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar72 & 1) * 0x7f800000;
            bVar75 = (bool)(bVar72 >> 1 & 1);
            auVar142._4_4_ = (uint)bVar75 * auVar114._4_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar72 >> 2 & 1);
            auVar142._8_4_ = (uint)bVar75 * auVar114._8_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar72 >> 3 & 1);
            auVar142._12_4_ = (uint)bVar75 * auVar114._12_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar72 >> 4 & 1);
            auVar142._16_4_ = (uint)bVar75 * auVar114._16_4_ | (uint)!bVar75 * 0x7f800000;
            bVar75 = (bool)(bVar72 >> 5 & 1);
            auVar142._20_4_ = (uint)bVar75 * auVar114._20_4_ | (uint)!bVar75 * 0x7f800000;
            auVar142._24_4_ =
                 (uint)(bVar72 >> 6) * auVar114._24_4_ | (uint)!(bool)(bVar72 >> 6) * 0x7f800000;
            auVar142._28_4_ = 0x7f800000;
            auVar114 = vshufps_avx(auVar142,auVar142,0xb1);
            auVar114 = vminps_avx(auVar142,auVar114);
            auVar92 = vshufpd_avx(auVar114,auVar114,5);
            auVar114 = vminps_avx(auVar114,auVar92);
            auVar92 = vpermpd_avx2(auVar114,0x4e);
            auVar114 = vminps_avx(auVar114,auVar92);
            uVar19 = vcmpps_avx512vl(auVar142,auVar114,0);
            bVar68 = (byte)uVar19 & bVar72;
            bVar66 = bVar72;
            if (bVar68 != 0) {
              bVar66 = bVar68;
            }
            iVar23 = 0;
            for (uVar77 = (uint)bVar66; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
              iVar23 = iVar23 + 1;
            }
            uVar77 = *(uint *)(local_340 + (uint)(iVar23 << 2));
            fVar255 = auVar79._0_4_;
            auVar81 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar23 << 2)));
            if ((float)local_800._0_4_ < 0.0) {
              local_880._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar23 << 2)));
              auVar259 = ZEXT1664(auVar259._0_16_);
              auVar264 = ZEXT1664(auVar264._0_16_);
              auVar266 = ZEXT1664(auVar266._0_16_);
              auVar271 = ZEXT1664(auVar271._0_16_);
              fVar255 = sqrtf((float)local_800._0_4_);
              auVar114 = vmovdqa64_avx512vl(auVar110);
              auVar274 = ZEXT3264(auVar114);
              auVar81 = local_880._0_16_;
            }
            auVar254 = ZEXT464(uVar77);
            auVar2 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar82 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar91 = vminps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar87 = vminps_avx(auVar2,auVar91);
            auVar2 = vmaxps_avx(local_7a0._0_16_,local_7e0._0_16_);
            auVar91 = vmaxps_avx(auVar82,auVar2);
            auVar215._8_4_ = 0x7fffffff;
            auVar215._0_8_ = 0x7fffffff7fffffff;
            auVar215._12_4_ = 0x7fffffff;
            auVar82 = vandps_avx(auVar87,auVar215);
            auVar2 = vandps_avx(auVar91,auVar215);
            auVar82 = vmaxps_avx(auVar82,auVar2);
            auVar2 = vmovshdup_avx(auVar82);
            auVar2 = vmaxss_avx(auVar2,auVar82);
            auVar82 = vshufpd_avx(auVar82,auVar82,1);
            auVar82 = vmaxss_avx(auVar82,auVar2);
            local_840._0_4_ = auVar82._0_4_ * 1.9073486e-06;
            local_6e0 = vshufps_avx(auVar91,auVar91,0xff);
            auVar81 = vinsertps_avx(ZEXT416(uVar77),auVar81,0x10);
            auVar263 = ZEXT1664(auVar81);
            lVar69 = 5;
            do {
              do {
                bVar75 = lVar69 == 0;
                lVar69 = lVar69 + -1;
                if (bVar75) goto LAB_01b2e086;
                uVar174 = auVar263._0_4_;
                auVar156._4_4_ = uVar174;
                auVar156._0_4_ = uVar174;
                auVar156._8_4_ = uVar174;
                auVar156._12_4_ = uVar174;
                auVar81 = vfmadd132ps_fma(auVar156,ZEXT816(0) << 0x40,local_7f0);
                local_740 = auVar263._0_32_;
                auVar82 = vmovshdup_avx(auVar263._0_16_);
                fVar225 = auVar82._0_4_;
                fVar239 = 1.0 - fVar225;
                fVar262 = fVar239 * fVar239 * fVar239;
                fVar260 = fVar225 * fVar225;
                fVar227 = fVar225 * fVar260;
                auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar262),
                                         ZEXT416((uint)fVar227));
                fVar261 = fVar225 * fVar239;
                auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar225 * fVar261 * 6.0)),
                                          ZEXT416((uint)(fVar239 * fVar261)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar91 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar227),
                                          ZEXT416((uint)fVar262));
                auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar239 * fVar261 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar225 * fVar261)));
                fVar262 = fVar262 * 0.16666667;
                fVar225 = (auVar2._0_4_ + auVar87._0_4_) * 0.16666667;
                fVar226 = (auVar91._0_4_ + auVar80._0_4_) * 0.16666667;
                fVar227 = fVar227 * 0.16666667;
                auVar197._0_4_ = fVar227 * (float)local_7e0._0_4_;
                auVar197._4_4_ = fVar227 * (float)local_7e0._4_4_;
                auVar197._8_4_ = fVar227 * fStack_7d8;
                auVar197._12_4_ = fVar227 * fStack_7d4;
                auVar231._4_4_ = fVar226;
                auVar231._0_4_ = fVar226;
                auVar231._8_4_ = fVar226;
                auVar231._12_4_ = fVar226;
                auVar2 = vfmadd132ps_fma(auVar231,auVar197,local_7a0._0_16_);
                auVar198._4_4_ = fVar225;
                auVar198._0_4_ = fVar225;
                auVar198._8_4_ = fVar225;
                auVar198._12_4_ = fVar225;
                auVar2 = vfmadd132ps_fma(auVar198,auVar2,local_7c0._0_16_);
                auVar180._4_4_ = fVar262;
                auVar180._0_4_ = fVar262;
                auVar180._8_4_ = fVar262;
                auVar180._12_4_ = fVar262;
                auVar2 = vfmadd132ps_fma(auVar180,auVar2,local_780._0_16_);
                local_600._0_16_ = auVar2;
                auVar2 = vsubps_avx(auVar81,auVar2);
                auVar81 = vdpps_avx(auVar2,auVar2,0x7f);
                local_820._0_16_ = auVar81;
                local_880._0_16_ = ZEXT416((uint)fVar239);
                if (auVar81._0_4_ < 0.0) {
                  local_8a0._0_4_ = fVar260;
                  local_8c0._0_4_ = fVar261;
                  auVar254._0_4_ = sqrtf(auVar81._0_4_);
                  auVar254._4_60_ = extraout_var_00;
                  auVar81 = auVar254._0_16_;
                  fVar261 = (float)local_8c0._0_4_;
                  auVar91 = local_880._0_16_;
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  local_8a0._0_4_ = fVar260;
                  auVar91 = ZEXT416((uint)fVar239);
                }
                local_620._4_4_ = auVar91._0_4_;
                local_620._0_4_ = local_620._4_4_;
                fStack_618 = (float)local_620._4_4_;
                fStack_614 = (float)local_620._4_4_;
                auVar87 = vfnmsub213ss_fma(auVar82,auVar82,ZEXT416((uint)(fVar261 * 4.0)));
                auVar91 = vfmadd231ss_fma(ZEXT416((uint)(fVar261 * 4.0)),auVar91,auVar91);
                fVar260 = (float)local_620._4_4_ * -(float)local_620._4_4_ * 0.5;
                fVar261 = auVar87._0_4_ * 0.5;
                fVar262 = auVar91._0_4_ * 0.5;
                local_8a0._0_4_ = (float)local_8a0._0_4_ * 0.5;
                auVar216._0_4_ = (float)local_8a0._0_4_ * (float)local_7e0._0_4_;
                auVar216._4_4_ = (float)local_8a0._0_4_ * (float)local_7e0._4_4_;
                auVar216._8_4_ = (float)local_8a0._0_4_ * fStack_7d8;
                auVar216._12_4_ = (float)local_8a0._0_4_ * fStack_7d4;
                auVar181._4_4_ = fVar262;
                auVar181._0_4_ = fVar262;
                auVar181._8_4_ = fVar262;
                auVar181._12_4_ = fVar262;
                auVar91 = vfmadd132ps_fma(auVar181,auVar216,local_7a0._0_16_);
                auVar199._4_4_ = fVar261;
                auVar199._0_4_ = fVar261;
                auVar199._8_4_ = fVar261;
                auVar199._12_4_ = fVar261;
                auVar91 = vfmadd132ps_fma(auVar199,auVar91,local_7c0._0_16_);
                auVar268._4_4_ = fVar260;
                auVar268._0_4_ = fVar260;
                auVar268._8_4_ = fVar260;
                auVar268._12_4_ = fVar260;
                _local_8a0 = vfmadd132ps_fma(auVar268,auVar91,local_780._0_16_);
                local_640._0_16_ = vdpps_avx(_local_8a0,_local_8a0,0x7f);
                auVar53._12_4_ = 0;
                auVar53._0_12_ = ZEXT812(0);
                fVar260 = local_640._0_4_;
                auVar87 = vrsqrt14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar260));
                local_660._0_16_ = vrcp14ss_avx512f(auVar53 << 0x20,ZEXT416((uint)fVar260));
                auVar91 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,ZEXT416(0x40000000));
                local_680._0_4_ = auVar91._0_4_;
                local_8c0._0_4_ = auVar81._0_4_;
                if (fVar260 < -fVar260) {
                  local_850 = auVar87;
                  fVar261 = sqrtf(fVar260);
                  auVar81 = ZEXT416((uint)local_8c0._0_4_);
                  auVar91 = local_850;
                  auVar80 = _local_8a0;
                }
                else {
                  auVar91 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
                  fVar261 = auVar91._0_4_;
                  auVar91 = auVar87;
                  auVar80 = _local_8a0;
                }
                fVar262 = auVar91._0_4_;
                auVar85 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(auVar87._0_4_ * 1.5 +
                                                   fVar260 * -0.5 * fVar262 * fVar262 * fVar262)));
                auVar84 = vmulps_avx512vl(auVar80,auVar85);
                auVar91 = vdpps_avx(auVar2,auVar84,0x7f);
                fVar260 = auVar81._0_4_ + 1.0;
                fVar262 = auVar91._0_4_;
                auVar157._0_4_ = fVar262 * fVar262;
                auVar157._4_4_ = auVar91._4_4_ * auVar91._4_4_;
                auVar157._8_4_ = auVar91._8_4_ * auVar91._8_4_;
                auVar157._12_4_ = auVar91._12_4_ * auVar91._12_4_;
                auVar87 = vsubps_avx(local_820._0_16_,auVar157);
                fVar225 = auVar87._0_4_;
                auVar182._4_12_ = ZEXT812(0) << 0x20;
                auVar182._0_4_ = fVar225;
                auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar182);
                auVar88 = vmulss_avx512f(auVar83,ZEXT416(0x3fc00000));
                auVar89 = vmulss_avx512f(auVar87,ZEXT416(0xbf000000));
                if (fVar225 < 0.0) {
                  local_850._0_4_ = fVar260;
                  local_6b0._0_4_ = auVar88._0_4_;
                  _local_6d0 = auVar85;
                  local_6c0 = auVar84;
                  local_6a0 = auVar83;
                  fVar225 = sqrtf(fVar225);
                  auVar89 = ZEXT416(auVar89._0_4_);
                  auVar88 = ZEXT416((uint)local_6b0._0_4_);
                  auVar81 = ZEXT416((uint)local_8c0._0_4_);
                  auVar83 = local_6a0;
                  auVar80 = _local_8a0;
                  fVar260 = (float)local_850._0_4_;
                  auVar84 = local_6c0;
                  auVar85 = _local_6d0;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                  fVar225 = auVar87._0_4_;
                }
                auVar271 = ZEXT1664(auVar80);
                auVar266 = ZEXT1664(local_820._0_16_);
                auVar264 = ZEXT1664(auVar2);
                auVar114 = vmovdqa64_avx512vl(auVar110);
                auVar274 = ZEXT3264(auVar114);
                auVar87 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_,auVar82);
                auVar86 = vfmadd213ss_fma(auVar82,SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_);
                auVar229 = local_740._0_16_;
                auVar82 = vshufps_avx(auVar229,auVar229,0x55);
                auVar200._0_4_ = auVar82._0_4_ * (float)local_7e0._0_4_;
                auVar200._4_4_ = auVar82._4_4_ * (float)local_7e0._4_4_;
                auVar200._8_4_ = auVar82._8_4_ * fStack_7d8;
                auVar200._12_4_ = auVar82._12_4_ * fStack_7d4;
                auVar217._0_4_ = auVar86._0_4_;
                auVar217._4_4_ = auVar217._0_4_;
                auVar217._8_4_ = auVar217._0_4_;
                auVar217._12_4_ = auVar217._0_4_;
                auVar82 = vfmadd132ps_fma(auVar217,auVar200,local_7a0._0_16_);
                auVar183._0_4_ = auVar87._0_4_;
                auVar183._4_4_ = auVar183._0_4_;
                auVar183._8_4_ = auVar183._0_4_;
                auVar183._12_4_ = auVar183._0_4_;
                auVar82 = vfmadd132ps_fma(auVar183,auVar82,local_7c0._0_16_);
                auVar82 = vfmadd132ps_fma(_local_620,auVar82,local_780._0_16_);
                auVar184._0_4_ = auVar82._0_4_ * (float)local_640._0_4_;
                auVar184._4_4_ = auVar82._4_4_ * (float)local_640._0_4_;
                auVar184._8_4_ = auVar82._8_4_ * (float)local_640._0_4_;
                auVar184._12_4_ = auVar82._12_4_ * (float)local_640._0_4_;
                auVar82 = vdpps_avx(auVar80,auVar82,0x7f);
                fVar226 = auVar82._0_4_;
                auVar201._0_4_ = auVar80._0_4_ * fVar226;
                auVar201._4_4_ = auVar80._4_4_ * fVar226;
                auVar201._8_4_ = auVar80._8_4_ * fVar226;
                auVar201._12_4_ = auVar80._12_4_ * fVar226;
                auVar82 = vsubps_avx(auVar184,auVar201);
                fVar226 = (float)local_680._0_4_ * (float)local_660._0_4_;
                auVar86 = vmaxss_avx(ZEXT416((uint)local_840._0_4_),
                                     ZEXT416((uint)(local_740._0_4_ * fVar255 * 1.9073486e-06)));
                auVar202._0_4_ = auVar82._0_4_ * fVar226;
                auVar202._4_4_ = auVar82._4_4_ * fVar226;
                auVar202._8_4_ = auVar82._8_4_ * fVar226;
                auVar202._12_4_ = auVar82._12_4_ * fVar226;
                auVar27._8_4_ = 0x80000000;
                auVar27._0_8_ = 0x8000000080000000;
                auVar27._12_4_ = 0x80000000;
                auVar90 = vxorps_avx512vl(auVar80,auVar27);
                auVar85 = vmulps_avx512vl(auVar85,auVar202);
                auVar82 = vdpps_avx(auVar90,auVar84,0x7f);
                auVar87 = vfmadd213ss_fma(auVar81,ZEXT416((uint)local_840._0_4_),auVar86);
                auVar81 = vdpps_avx(auVar2,auVar85,0x7f);
                auVar85 = vfmadd213ss_fma(ZEXT416((uint)fVar260),
                                          ZEXT416((uint)((float)local_840._0_4_ / fVar261)),auVar87)
                ;
                fVar260 = auVar82._0_4_ + auVar81._0_4_;
                auVar81 = vdpps_avx(local_7f0,auVar84,0x7f);
                auVar82 = vdpps_avx(auVar2,auVar90,0x7f);
                auVar87 = vmulss_avx512f(auVar89,auVar83);
                auVar88 = vaddss_avx512f(auVar88,ZEXT416((uint)(auVar87._0_4_ *
                                                               auVar83._0_4_ * auVar83._0_4_)));
                auVar87 = vdpps_avx(auVar2,local_7f0,0x7f);
                auVar84 = vfnmadd231ss_fma(auVar82,auVar91,ZEXT416((uint)fVar260));
                auVar87 = vfnmadd231ss_fma(auVar87,auVar91,auVar81);
                auVar82 = vpermilps_avx(local_600._0_16_,0xff);
                fVar225 = fVar225 - auVar82._0_4_;
                auVar83 = vshufps_avx(auVar80,auVar80,0xff);
                auVar82 = vfmsub213ss_fma(auVar84,auVar88,auVar83);
                auVar257._8_4_ = 0x80000000;
                auVar257._0_8_ = 0x8000000080000000;
                auVar257._12_4_ = 0x80000000;
                auVar259 = ZEXT1664(auVar257);
                auVar251._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
                auVar251._8_4_ = auVar82._8_4_ ^ 0x80000000;
                auVar251._12_4_ = auVar82._12_4_ ^ 0x80000000;
                auVar254 = ZEXT1664(auVar251);
                auVar87 = ZEXT416((uint)(auVar87._0_4_ * auVar88._0_4_));
                auVar84 = vfmsub231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar82._0_4_)),
                                          ZEXT416((uint)fVar260),auVar87);
                auVar82 = vinsertps_avx(auVar251,auVar87,0x1c);
                auVar242._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
                auVar242._8_4_ = auVar81._8_4_ ^ 0x80000000;
                auVar242._12_4_ = auVar81._12_4_ ^ 0x80000000;
                auVar87 = vinsertps_avx(ZEXT416((uint)fVar260),auVar242,0x10);
                auVar218._0_4_ = auVar84._0_4_;
                auVar218._4_4_ = auVar218._0_4_;
                auVar218._8_4_ = auVar218._0_4_;
                auVar218._12_4_ = auVar218._0_4_;
                auVar81 = vdivps_avx(auVar82,auVar218);
                auVar82 = vdivps_avx(auVar87,auVar218);
                auVar219._0_4_ = fVar262 * auVar81._0_4_ + fVar225 * auVar82._0_4_;
                auVar219._4_4_ = fVar262 * auVar81._4_4_ + fVar225 * auVar82._4_4_;
                auVar219._8_4_ = fVar262 * auVar81._8_4_ + fVar225 * auVar82._8_4_;
                auVar219._12_4_ = fVar262 * auVar81._12_4_ + fVar225 * auVar82._12_4_;
                auVar81 = vsubps_avx(auVar229,auVar219);
                auVar263 = ZEXT1664(auVar81);
                auVar28._8_4_ = 0x7fffffff;
                auVar28._0_8_ = 0x7fffffff7fffffff;
                auVar28._12_4_ = 0x7fffffff;
                auVar82 = vandps_avx512vl(auVar91,auVar28);
              } while (auVar85._0_4_ <= auVar82._0_4_);
              auVar82 = vfmadd231ss_fma(ZEXT416((uint)(auVar85._0_4_ + auVar86._0_4_)),local_6e0,
                                        ZEXT416(0x36000000));
              auVar29._8_4_ = 0x7fffffff;
              auVar29._0_8_ = 0x7fffffff7fffffff;
              auVar29._12_4_ = 0x7fffffff;
              auVar91 = vandps_avx512vl(ZEXT416((uint)fVar225),auVar29);
            } while (auVar82._0_4_ <= auVar91._0_4_);
            fVar255 = auVar81._0_4_ + (float)local_6f0._0_4_;
            if ((fVar18 <= fVar255) &&
               (fVar260 = *(float *)(ray + k * 4 + 0x100), fVar255 <= fVar260)) {
              auVar82 = vmovshdup_avx(auVar81);
              fVar261 = auVar82._0_4_;
              if ((0.0 <= fVar261) && (fVar261 <= 1.0)) {
                auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_820._0_4_));
                fVar262 = auVar82._0_4_;
                pGVar5 = (context->scene->geometries).items[uVar3].ptr;
                if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar262 = fVar262 * 1.5 + local_820._0_4_ * -0.5 * fVar262 * fVar262 * fVar262;
                  auVar220._0_4_ = auVar2._0_4_ * fVar262;
                  auVar220._4_4_ = auVar2._4_4_ * fVar262;
                  auVar220._8_4_ = auVar2._8_4_ * fVar262;
                  auVar220._12_4_ = auVar2._12_4_ * fVar262;
                  auVar83 = vfmadd213ps_fma(auVar83,auVar220,auVar80);
                  auVar82 = vshufps_avx(auVar220,auVar220,0xc9);
                  auVar91 = vshufps_avx(auVar80,auVar80,0xc9);
                  auVar221._0_4_ = auVar220._0_4_ * auVar91._0_4_;
                  auVar221._4_4_ = auVar220._4_4_ * auVar91._4_4_;
                  auVar221._8_4_ = auVar220._8_4_ * auVar91._8_4_;
                  auVar221._12_4_ = auVar220._12_4_ * auVar91._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar221,auVar80,auVar82);
                  auVar82 = vshufps_avx(auVar87,auVar87,0xc9);
                  auVar91 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar87 = vshufps_avx(auVar87,auVar87,0xd2);
                  auVar158._0_4_ = auVar83._0_4_ * auVar87._0_4_;
                  auVar158._4_4_ = auVar83._4_4_ * auVar87._4_4_;
                  auVar158._8_4_ = auVar83._8_4_ * auVar87._8_4_;
                  auVar158._12_4_ = auVar83._12_4_ * auVar87._12_4_;
                  auVar82 = vfmsub231ps_fma(auVar158,auVar82,auVar91);
                  uVar174 = auVar82._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar255;
                    uVar4 = vextractps_avx(auVar82,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                    uVar4 = vextractps_avx(auVar82,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar174;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar261;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_828;
                    *(uint *)(ray + k * 4 + 0x240) = uVar3;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar9 = context->user;
                    auVar223._8_4_ = 1;
                    auVar223._0_8_ = 0x100000001;
                    auVar223._12_4_ = 1;
                    auVar223._16_4_ = 1;
                    auVar223._20_4_ = 1;
                    auVar223._24_4_ = 1;
                    auVar223._28_4_ = 1;
                    local_420 = vpermps_avx2(auVar223,ZEXT1632(auVar81));
                    auVar114 = vpermps_avx2(auVar223,ZEXT1632(auVar82));
                    auVar235._8_4_ = 2;
                    auVar235._0_8_ = 0x200000002;
                    auVar235._12_4_ = 2;
                    auVar235._16_4_ = 2;
                    auVar235._20_4_ = 2;
                    auVar235._24_4_ = 2;
                    auVar235._28_4_ = 2;
                    local_460 = vpermps_avx2(auVar235,ZEXT1632(auVar82));
                    local_480[0] = (RTCHitN)auVar114[0];
                    local_480[1] = (RTCHitN)auVar114[1];
                    local_480[2] = (RTCHitN)auVar114[2];
                    local_480[3] = (RTCHitN)auVar114[3];
                    local_480[4] = (RTCHitN)auVar114[4];
                    local_480[5] = (RTCHitN)auVar114[5];
                    local_480[6] = (RTCHitN)auVar114[6];
                    local_480[7] = (RTCHitN)auVar114[7];
                    local_480[8] = (RTCHitN)auVar114[8];
                    local_480[9] = (RTCHitN)auVar114[9];
                    local_480[10] = (RTCHitN)auVar114[10];
                    local_480[0xb] = (RTCHitN)auVar114[0xb];
                    local_480[0xc] = (RTCHitN)auVar114[0xc];
                    local_480[0xd] = (RTCHitN)auVar114[0xd];
                    local_480[0xe] = (RTCHitN)auVar114[0xe];
                    local_480[0xf] = (RTCHitN)auVar114[0xf];
                    local_480[0x10] = (RTCHitN)auVar114[0x10];
                    local_480[0x11] = (RTCHitN)auVar114[0x11];
                    local_480[0x12] = (RTCHitN)auVar114[0x12];
                    local_480[0x13] = (RTCHitN)auVar114[0x13];
                    local_480[0x14] = (RTCHitN)auVar114[0x14];
                    local_480[0x15] = (RTCHitN)auVar114[0x15];
                    local_480[0x16] = (RTCHitN)auVar114[0x16];
                    local_480[0x17] = (RTCHitN)auVar114[0x17];
                    local_480[0x18] = (RTCHitN)auVar114[0x18];
                    local_480[0x19] = (RTCHitN)auVar114[0x19];
                    local_480[0x1a] = (RTCHitN)auVar114[0x1a];
                    local_480[0x1b] = (RTCHitN)auVar114[0x1b];
                    local_480[0x1c] = (RTCHitN)auVar114[0x1c];
                    local_480[0x1d] = (RTCHitN)auVar114[0x1d];
                    local_480[0x1e] = (RTCHitN)auVar114[0x1e];
                    local_480[0x1f] = (RTCHitN)auVar114[0x1f];
                    local_440 = uVar174;
                    uStack_43c = uVar174;
                    uStack_438 = uVar174;
                    uStack_434 = uVar174;
                    uStack_430 = uVar174;
                    uStack_42c = uVar174;
                    uStack_428 = uVar174;
                    uStack_424 = uVar174;
                    local_400 = ZEXT432(0) << 0x20;
                    local_3e0 = local_4e0._0_8_;
                    uStack_3d8 = local_4e0._8_8_;
                    uStack_3d0 = local_4e0._16_8_;
                    uStack_3c8 = local_4e0._24_8_;
                    local_3c0 = local_4c0;
                    auVar114 = vpcmpeqd_avx2(local_4c0,local_4c0);
                    local_830[1] = auVar114;
                    *local_830 = auVar114;
                    local_3a0 = pRVar9->instID[0];
                    uStack_39c = local_3a0;
                    uStack_398 = local_3a0;
                    uStack_394 = local_3a0;
                    uStack_390 = local_3a0;
                    uStack_38c = local_3a0;
                    uStack_388 = local_3a0;
                    uStack_384 = local_3a0;
                    local_380 = pRVar9->instPrimID[0];
                    uStack_37c = local_380;
                    uStack_378 = local_380;
                    uStack_374 = local_380;
                    uStack_370 = local_380;
                    uStack_36c = local_380;
                    uStack_368 = local_380;
                    uStack_364 = local_380;
                    *(float *)(ray + k * 4 + 0x100) = fVar255;
                    local_720 = local_520;
                    local_8f0.valid = (int *)local_720;
                    local_8f0.geometryUserPtr = pGVar5->userPtr;
                    local_8f0.context = context->user;
                    local_8f0.hit = local_480;
                    local_8f0.N = 8;
                    local_8f0.ray = (RTCRayN *)ray;
                    if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar254 = ZEXT1664(auVar251);
                      auVar259 = ZEXT1664(auVar257);
                      auVar263 = ZEXT1664(auVar81);
                      auVar264 = ZEXT1664(auVar2);
                      auVar266 = ZEXT1664(local_820._0_16_);
                      auVar271 = ZEXT1664(auVar80);
                      (*pGVar5->intersectionFilterN)(&local_8f0);
                      auVar114 = vmovdqa64_avx512vl(auVar110);
                      auVar274 = ZEXT3264(auVar114);
                    }
                    if (local_720 != (undefined1  [32])0x0) {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar254 = ZEXT1664(auVar254._0_16_);
                        auVar259 = ZEXT1664(auVar259._0_16_);
                        auVar263 = ZEXT1664(auVar263._0_16_);
                        auVar264 = ZEXT1664(auVar264._0_16_);
                        auVar266 = ZEXT1664(auVar266._0_16_);
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        (*p_Var10)(&local_8f0);
                        auVar114 = vmovdqa64_avx512vl(auVar110);
                        auVar274 = ZEXT3264(auVar114);
                      }
                      if (local_720 != (undefined1  [32])0x0) {
                        uVar76 = vptestmd_avx512vl(local_720,local_720);
                        iVar54 = *(int *)(local_8f0.hit + 4);
                        iVar55 = *(int *)(local_8f0.hit + 8);
                        iVar56 = *(int *)(local_8f0.hit + 0xc);
                        iVar57 = *(int *)(local_8f0.hit + 0x10);
                        iVar58 = *(int *)(local_8f0.hit + 0x14);
                        iVar59 = *(int *)(local_8f0.hit + 0x18);
                        iVar60 = *(int *)(local_8f0.hit + 0x1c);
                        bVar66 = (byte)uVar76;
                        bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar16 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_8f0.ray + 0x180) =
                             (uint)(bVar66 & 1) * *(int *)local_8f0.hit |
                             (uint)!(bool)(bVar66 & 1) * *(int *)(local_8f0.ray + 0x180);
                        *(uint *)(local_8f0.ray + 0x184) =
                             (uint)bVar75 * iVar54 | (uint)!bVar75 * *(int *)(local_8f0.ray + 0x184)
                        ;
                        *(uint *)(local_8f0.ray + 0x188) =
                             (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_8f0.ray + 0x188)
                        ;
                        *(uint *)(local_8f0.ray + 0x18c) =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_8f0.ray + 0x18c)
                        ;
                        *(uint *)(local_8f0.ray + 400) =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_8f0.ray + 400);
                        *(uint *)(local_8f0.ray + 0x194) =
                             (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_8f0.ray + 0x194)
                        ;
                        *(uint *)(local_8f0.ray + 0x198) =
                             (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_8f0.ray + 0x198)
                        ;
                        *(uint *)(local_8f0.ray + 0x19c) =
                             (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_8f0.ray + 0x19c)
                        ;
                        iVar54 = *(int *)(local_8f0.hit + 0x24);
                        iVar55 = *(int *)(local_8f0.hit + 0x28);
                        iVar56 = *(int *)(local_8f0.hit + 0x2c);
                        iVar57 = *(int *)(local_8f0.hit + 0x30);
                        iVar58 = *(int *)(local_8f0.hit + 0x34);
                        iVar59 = *(int *)(local_8f0.hit + 0x38);
                        iVar60 = *(int *)(local_8f0.hit + 0x3c);
                        bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar16 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_8f0.ray + 0x1a0) =
                             (uint)(bVar66 & 1) * *(int *)(local_8f0.hit + 0x20) |
                             (uint)!(bool)(bVar66 & 1) * *(int *)(local_8f0.ray + 0x1a0);
                        *(uint *)(local_8f0.ray + 0x1a4) =
                             (uint)bVar75 * iVar54 | (uint)!bVar75 * *(int *)(local_8f0.ray + 0x1a4)
                        ;
                        *(uint *)(local_8f0.ray + 0x1a8) =
                             (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_8f0.ray + 0x1a8)
                        ;
                        *(uint *)(local_8f0.ray + 0x1ac) =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_8f0.ray + 0x1ac)
                        ;
                        *(uint *)(local_8f0.ray + 0x1b0) =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_8f0.ray + 0x1b0)
                        ;
                        *(uint *)(local_8f0.ray + 0x1b4) =
                             (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_8f0.ray + 0x1b4)
                        ;
                        *(uint *)(local_8f0.ray + 0x1b8) =
                             (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_8f0.ray + 0x1b8)
                        ;
                        *(uint *)(local_8f0.ray + 0x1bc) =
                             (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_8f0.ray + 0x1bc)
                        ;
                        iVar54 = *(int *)(local_8f0.hit + 0x44);
                        iVar55 = *(int *)(local_8f0.hit + 0x48);
                        iVar56 = *(int *)(local_8f0.hit + 0x4c);
                        iVar57 = *(int *)(local_8f0.hit + 0x50);
                        iVar58 = *(int *)(local_8f0.hit + 0x54);
                        iVar59 = *(int *)(local_8f0.hit + 0x58);
                        iVar60 = *(int *)(local_8f0.hit + 0x5c);
                        bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar16 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_8f0.ray + 0x1c0) =
                             (uint)(bVar66 & 1) * *(int *)(local_8f0.hit + 0x40) |
                             (uint)!(bool)(bVar66 & 1) * *(int *)(local_8f0.ray + 0x1c0);
                        *(uint *)(local_8f0.ray + 0x1c4) =
                             (uint)bVar75 * iVar54 | (uint)!bVar75 * *(int *)(local_8f0.ray + 0x1c4)
                        ;
                        *(uint *)(local_8f0.ray + 0x1c8) =
                             (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_8f0.ray + 0x1c8)
                        ;
                        *(uint *)(local_8f0.ray + 0x1cc) =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_8f0.ray + 0x1cc)
                        ;
                        *(uint *)(local_8f0.ray + 0x1d0) =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_8f0.ray + 0x1d0)
                        ;
                        *(uint *)(local_8f0.ray + 0x1d4) =
                             (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_8f0.ray + 0x1d4)
                        ;
                        *(uint *)(local_8f0.ray + 0x1d8) =
                             (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_8f0.ray + 0x1d8)
                        ;
                        *(uint *)(local_8f0.ray + 0x1dc) =
                             (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_8f0.ray + 0x1dc)
                        ;
                        iVar54 = *(int *)(local_8f0.hit + 100);
                        iVar55 = *(int *)(local_8f0.hit + 0x68);
                        iVar56 = *(int *)(local_8f0.hit + 0x6c);
                        iVar57 = *(int *)(local_8f0.hit + 0x70);
                        iVar58 = *(int *)(local_8f0.hit + 0x74);
                        iVar59 = *(int *)(local_8f0.hit + 0x78);
                        iVar60 = *(int *)(local_8f0.hit + 0x7c);
                        bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar16 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_8f0.ray + 0x1e0) =
                             (uint)(bVar66 & 1) * *(int *)(local_8f0.hit + 0x60) |
                             (uint)!(bool)(bVar66 & 1) * *(int *)(local_8f0.ray + 0x1e0);
                        *(uint *)(local_8f0.ray + 0x1e4) =
                             (uint)bVar75 * iVar54 | (uint)!bVar75 * *(int *)(local_8f0.ray + 0x1e4)
                        ;
                        *(uint *)(local_8f0.ray + 0x1e8) =
                             (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_8f0.ray + 0x1e8)
                        ;
                        *(uint *)(local_8f0.ray + 0x1ec) =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_8f0.ray + 0x1ec)
                        ;
                        *(uint *)(local_8f0.ray + 0x1f0) =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_8f0.ray + 0x1f0)
                        ;
                        *(uint *)(local_8f0.ray + 500) =
                             (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_8f0.ray + 500);
                        *(uint *)(local_8f0.ray + 0x1f8) =
                             (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_8f0.ray + 0x1f8)
                        ;
                        *(uint *)(local_8f0.ray + 0x1fc) =
                             (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_8f0.ray + 0x1fc)
                        ;
                        iVar54 = *(int *)(local_8f0.hit + 0x84);
                        iVar55 = *(int *)(local_8f0.hit + 0x88);
                        iVar56 = *(int *)(local_8f0.hit + 0x8c);
                        iVar57 = *(int *)(local_8f0.hit + 0x90);
                        iVar58 = *(int *)(local_8f0.hit + 0x94);
                        iVar59 = *(int *)(local_8f0.hit + 0x98);
                        iVar60 = *(int *)(local_8f0.hit + 0x9c);
                        bVar75 = (bool)((byte)(uVar76 >> 1) & 1);
                        bVar11 = (bool)((byte)(uVar76 >> 2) & 1);
                        bVar12 = (bool)((byte)(uVar76 >> 3) & 1);
                        bVar13 = (bool)((byte)(uVar76 >> 4) & 1);
                        bVar14 = (bool)((byte)(uVar76 >> 5) & 1);
                        bVar15 = (bool)((byte)(uVar76 >> 6) & 1);
                        bVar16 = SUB81(uVar76 >> 7,0);
                        *(uint *)(local_8f0.ray + 0x200) =
                             (uint)(bVar66 & 1) * *(int *)(local_8f0.hit + 0x80) |
                             (uint)!(bool)(bVar66 & 1) * *(int *)(local_8f0.ray + 0x200);
                        *(uint *)(local_8f0.ray + 0x204) =
                             (uint)bVar75 * iVar54 | (uint)!bVar75 * *(int *)(local_8f0.ray + 0x204)
                        ;
                        *(uint *)(local_8f0.ray + 0x208) =
                             (uint)bVar11 * iVar55 | (uint)!bVar11 * *(int *)(local_8f0.ray + 0x208)
                        ;
                        *(uint *)(local_8f0.ray + 0x20c) =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_8f0.ray + 0x20c)
                        ;
                        *(uint *)(local_8f0.ray + 0x210) =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_8f0.ray + 0x210)
                        ;
                        *(uint *)(local_8f0.ray + 0x214) =
                             (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_8f0.ray + 0x214)
                        ;
                        *(uint *)(local_8f0.ray + 0x218) =
                             (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_8f0.ray + 0x218)
                        ;
                        *(uint *)(local_8f0.ray + 0x21c) =
                             (uint)bVar16 * iVar60 | (uint)!bVar16 * *(int *)(local_8f0.ray + 0x21c)
                        ;
                        auVar114 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8f0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_8f0.ray + 0x220) = auVar114;
                        auVar114 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_8f0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_8f0.ray + 0x240) = auVar114;
                        auVar114 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8f0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_8f0.ray + 0x260) = auVar114;
                        auVar114 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_8f0.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_8f0.ray + 0x280) = auVar114;
                        goto LAB_01b2e086;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar260;
                  }
                }
              }
            }
LAB_01b2e086:
            uVar174 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar244._4_4_ = uVar174;
            auVar244._0_4_ = uVar174;
            auVar244._8_4_ = uVar174;
            auVar244._12_4_ = uVar174;
            auVar244._16_4_ = uVar174;
            auVar244._20_4_ = uVar174;
            auVar244._24_4_ = uVar174;
            auVar244._28_4_ = uVar174;
            auVar245 = ZEXT3264(auVar244);
            auVar62._4_4_ = fStack_55c;
            auVar62._0_4_ = local_560;
            auVar62._8_4_ = fStack_558;
            auVar62._12_4_ = fStack_554;
            auVar62._16_4_ = fStack_550;
            auVar62._20_4_ = fStack_54c;
            auVar62._24_4_ = fStack_548;
            auVar62._28_4_ = fStack_544;
            uVar19 = vcmpps_avx512vl(auVar244,auVar62,0xd);
            auVar249 = ZEXT3264(CONCAT428(0x7fffffff,
                                          CONCAT424(0x7fffffff,
                                                    CONCAT420(0x7fffffff,
                                                              CONCAT416(0x7fffffff,
                                                                        CONCAT412(0x7fffffff,
                                                                                  CONCAT48(
                                                  0x7fffffff,0x7fffffff7fffffff)))))));
          }
          uVar22 = vpcmpd_avx512vl(local_500,local_320,1);
          uVar21 = vpcmpd_avx512vl(local_500,_local_580,1);
          auVar187._0_4_ = (float)local_760._0_4_ + (float)local_200._0_4_;
          auVar187._4_4_ = (float)local_760._4_4_ + (float)local_200._4_4_;
          auVar187._8_4_ = fStack_758 + fStack_1f8;
          auVar187._12_4_ = fStack_754 + fStack_1f4;
          auVar187._16_4_ = fStack_750 + fStack_1f0;
          auVar187._20_4_ = fStack_74c + fStack_1ec;
          auVar187._24_4_ = fStack_748 + fStack_1e8;
          auVar187._28_4_ = fStack_744 + fStack_1e4;
          uVar174 = auVar245._0_4_;
          auVar203._4_4_ = uVar174;
          auVar203._0_4_ = uVar174;
          auVar203._8_4_ = uVar174;
          auVar203._12_4_ = uVar174;
          auVar203._16_4_ = uVar174;
          auVar203._20_4_ = uVar174;
          auVar203._24_4_ = uVar174;
          auVar203._28_4_ = uVar174;
          uVar19 = vcmpps_avx512vl(auVar187,auVar203,2);
          bVar71 = bVar71 & (byte)uVar22 & (byte)uVar19;
          auVar224._0_4_ = (float)local_760._0_4_ + (float)local_360._0_4_;
          auVar224._4_4_ = (float)local_760._4_4_ + (float)local_360._4_4_;
          auVar224._8_4_ = fStack_758 + fStack_358;
          auVar224._12_4_ = fStack_754 + fStack_354;
          auVar224._16_4_ = fStack_750 + fStack_350;
          auVar224._20_4_ = fStack_74c + fStack_34c;
          auVar224._24_4_ = fStack_748 + fStack_348;
          auVar224._28_4_ = fStack_744 + fStack_344;
          uVar19 = vcmpps_avx512vl(auVar224,auVar203,2);
          bVar65 = bVar65 & (byte)uVar21 & (byte)uVar19 | bVar71;
          if (bVar65 != 0) {
            abStack_180[uVar70 * 0x60] = bVar65;
            bVar75 = (bool)(bVar71 >> 1 & 1);
            bVar11 = (bool)(bVar71 >> 2 & 1);
            bVar12 = (bool)(bVar71 >> 3 & 1);
            bVar13 = (bool)(bVar71 >> 4 & 1);
            bVar14 = (bool)(bVar71 >> 5 & 1);
            auStack_160[uVar70 * 0x18] =
                 (uint)(bVar71 & 1) * local_200._0_4_ | (uint)!(bool)(bVar71 & 1) * local_360._0_4_;
            auStack_160[uVar70 * 0x18 + 1] =
                 (uint)bVar75 * local_200._4_4_ | (uint)!bVar75 * local_360._4_4_;
            auStack_160[uVar70 * 0x18 + 2] =
                 (uint)bVar11 * (int)fStack_1f8 | (uint)!bVar11 * (int)fStack_358;
            auStack_160[uVar70 * 0x18 + 3] =
                 (uint)bVar12 * (int)fStack_1f4 | (uint)!bVar12 * (int)fStack_354;
            auStack_160[uVar70 * 0x18 + 4] =
                 (uint)bVar13 * (int)fStack_1f0 | (uint)!bVar13 * (int)fStack_350;
            auStack_160[uVar70 * 0x18 + 5] =
                 (uint)bVar14 * (int)fStack_1ec | (uint)!bVar14 * (int)fStack_34c;
            auStack_160[uVar70 * 0x18 + 6] =
                 (uint)(bVar71 >> 6) * (int)fStack_1e8 |
                 (uint)!(bool)(bVar71 >> 6) * (int)fStack_348;
            (&fStack_144)[uVar70 * 0x18] = fStack_344;
            uVar76 = vmovlps_avx(local_530);
            (&uStack_140)[uVar70 * 0xc] = uVar76;
            aiStack_138[uVar70 * 0x18] = iVar73 + 1;
            uVar70 = (ulong)((int)uVar70 + 1);
          }
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar275 = ZEXT3264(auVar114);
          fVar255 = (float)local_760._0_4_;
          fVar260 = (float)local_760._4_4_;
          fVar261 = fStack_758;
          fVar262 = fStack_754;
          fVar225 = fStack_750;
          fVar226 = fStack_74c;
          fVar227 = fStack_748;
          fVar239 = fStack_744;
        }
      }
    }
    do {
      uVar77 = (uint)uVar70;
      uVar70 = (ulong)(uVar77 - 1);
      if (uVar77 == 0) {
        uVar174 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar36._4_4_ = uVar174;
        auVar36._0_4_ = uVar174;
        auVar36._8_4_ = uVar174;
        auVar36._12_4_ = uVar174;
        auVar36._16_4_ = uVar174;
        auVar36._20_4_ = uVar174;
        auVar36._24_4_ = uVar174;
        auVar36._28_4_ = uVar174;
        uVar19 = vcmpps_avx512vl(local_300,auVar36,2);
        local_688 = (ulong)((uint)uVar19 & (uint)local_688 - 1 & (uint)local_688);
        goto LAB_01b2b9a1;
      }
      auVar114 = *(undefined1 (*) [32])(auStack_160 + uVar70 * 0x18);
      auVar188._0_4_ = fVar255 + auVar114._0_4_;
      auVar188._4_4_ = fVar260 + auVar114._4_4_;
      auVar188._8_4_ = fVar261 + auVar114._8_4_;
      auVar188._12_4_ = fVar262 + auVar114._12_4_;
      auVar188._16_4_ = fVar225 + auVar114._16_4_;
      auVar188._20_4_ = fVar226 + auVar114._20_4_;
      auVar188._24_4_ = fVar227 + auVar114._24_4_;
      auVar188._28_4_ = fVar239 + auVar114._28_4_;
      uVar174 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar35._4_4_ = uVar174;
      auVar35._0_4_ = uVar174;
      auVar35._8_4_ = uVar174;
      auVar35._12_4_ = uVar174;
      auVar35._16_4_ = uVar174;
      auVar35._20_4_ = uVar174;
      auVar35._24_4_ = uVar174;
      auVar35._28_4_ = uVar174;
      uVar19 = vcmpps_avx512vl(auVar188,auVar35,2);
      uVar144 = (uint)uVar19 & (uint)abStack_180[uVar70 * 0x60];
    } while (uVar144 == 0);
    uVar76 = (&uStack_140)[uVar70 * 0xc];
    auVar185._8_8_ = 0;
    auVar185._0_8_ = uVar76;
    auVar204._8_4_ = 0x7f800000;
    auVar204._0_8_ = 0x7f8000007f800000;
    auVar204._12_4_ = 0x7f800000;
    auVar204._16_4_ = 0x7f800000;
    auVar204._20_4_ = 0x7f800000;
    auVar204._24_4_ = 0x7f800000;
    auVar204._28_4_ = 0x7f800000;
    auVar92 = vblendmps_avx512vl(auVar204,auVar114);
    bVar65 = (byte)uVar144;
    auVar143._0_4_ =
         (uint)(bVar65 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar65 & 1) * (int)auVar114._0_4_;
    bVar75 = (bool)((byte)(uVar144 >> 1) & 1);
    auVar143._4_4_ = (uint)bVar75 * auVar92._4_4_ | (uint)!bVar75 * (int)auVar114._4_4_;
    bVar75 = (bool)((byte)(uVar144 >> 2) & 1);
    auVar143._8_4_ = (uint)bVar75 * auVar92._8_4_ | (uint)!bVar75 * (int)auVar114._8_4_;
    bVar75 = (bool)((byte)(uVar144 >> 3) & 1);
    auVar143._12_4_ = (uint)bVar75 * auVar92._12_4_ | (uint)!bVar75 * (int)auVar114._12_4_;
    bVar75 = (bool)((byte)(uVar144 >> 4) & 1);
    auVar143._16_4_ = (uint)bVar75 * auVar92._16_4_ | (uint)!bVar75 * (int)auVar114._16_4_;
    bVar75 = (bool)((byte)(uVar144 >> 5) & 1);
    auVar143._20_4_ = (uint)bVar75 * auVar92._20_4_ | (uint)!bVar75 * (int)auVar114._20_4_;
    bVar75 = (bool)((byte)(uVar144 >> 6) & 1);
    auVar143._24_4_ = (uint)bVar75 * auVar92._24_4_ | (uint)!bVar75 * (int)auVar114._24_4_;
    auVar143._28_4_ =
         (uVar144 >> 7) * auVar92._28_4_ | (uint)!SUB41(uVar144 >> 7,0) * (int)auVar114._28_4_;
    auVar114 = vshufps_avx(auVar143,auVar143,0xb1);
    auVar114 = vminps_avx(auVar143,auVar114);
    auVar92 = vshufpd_avx(auVar114,auVar114,5);
    auVar114 = vminps_avx(auVar114,auVar92);
    auVar92 = vpermpd_avx2(auVar114,0x4e);
    auVar114 = vminps_avx(auVar114,auVar92);
    uVar19 = vcmpps_avx512vl(auVar143,auVar114,0);
    bVar72 = (byte)uVar19 & bVar65;
    if (bVar72 != 0) {
      uVar144 = (uint)bVar72;
    }
    uVar145 = 0;
    for (; (uVar144 & 1) == 0; uVar144 = uVar144 >> 1 | 0x80000000) {
      uVar145 = uVar145 + 1;
    }
    iVar73 = aiStack_138[uVar70 * 0x18];
    bVar65 = ~('\x01' << ((byte)uVar145 & 0x1f)) & bVar65;
    abStack_180[uVar70 * 0x60] = bVar65;
    if (bVar65 == 0) {
      uVar77 = uVar77 - 1;
    }
    uVar174 = (undefined4)uVar76;
    auVar167._4_4_ = uVar174;
    auVar167._0_4_ = uVar174;
    auVar167._8_4_ = uVar174;
    auVar167._12_4_ = uVar174;
    auVar167._16_4_ = uVar174;
    auVar167._20_4_ = uVar174;
    auVar167._24_4_ = uVar174;
    auVar167._28_4_ = uVar174;
    auVar81 = vmovshdup_avx(auVar185);
    auVar81 = vsubps_avx(auVar81,auVar185);
    auVar189._0_4_ = auVar81._0_4_;
    auVar189._4_4_ = auVar189._0_4_;
    auVar189._8_4_ = auVar189._0_4_;
    auVar189._12_4_ = auVar189._0_4_;
    auVar189._16_4_ = auVar189._0_4_;
    auVar189._20_4_ = auVar189._0_4_;
    auVar189._24_4_ = auVar189._0_4_;
    auVar189._28_4_ = auVar189._0_4_;
    auVar81 = vfmadd132ps_fma(auVar189,auVar167,_DAT_01f7b040);
    auVar114 = ZEXT1632(auVar81);
    local_480[0] = (RTCHitN)auVar114[0];
    local_480[1] = (RTCHitN)auVar114[1];
    local_480[2] = (RTCHitN)auVar114[2];
    local_480[3] = (RTCHitN)auVar114[3];
    local_480[4] = (RTCHitN)auVar114[4];
    local_480[5] = (RTCHitN)auVar114[5];
    local_480[6] = (RTCHitN)auVar114[6];
    local_480[7] = (RTCHitN)auVar114[7];
    local_480[8] = (RTCHitN)auVar114[8];
    local_480[9] = (RTCHitN)auVar114[9];
    local_480[10] = (RTCHitN)auVar114[10];
    local_480[0xb] = (RTCHitN)auVar114[0xb];
    local_480[0xc] = (RTCHitN)auVar114[0xc];
    local_480[0xd] = (RTCHitN)auVar114[0xd];
    local_480[0xe] = (RTCHitN)auVar114[0xe];
    local_480[0xf] = (RTCHitN)auVar114[0xf];
    local_480[0x10] = (RTCHitN)auVar114[0x10];
    local_480[0x11] = (RTCHitN)auVar114[0x11];
    local_480[0x12] = (RTCHitN)auVar114[0x12];
    local_480[0x13] = (RTCHitN)auVar114[0x13];
    local_480[0x14] = (RTCHitN)auVar114[0x14];
    local_480[0x15] = (RTCHitN)auVar114[0x15];
    local_480[0x16] = (RTCHitN)auVar114[0x16];
    local_480[0x17] = (RTCHitN)auVar114[0x17];
    local_480[0x18] = (RTCHitN)auVar114[0x18];
    local_480[0x19] = (RTCHitN)auVar114[0x19];
    local_480[0x1a] = (RTCHitN)auVar114[0x1a];
    local_480[0x1b] = (RTCHitN)auVar114[0x1b];
    local_480[0x1c] = (RTCHitN)auVar114[0x1c];
    local_480[0x1d] = (RTCHitN)auVar114[0x1d];
    local_480[0x1e] = (RTCHitN)auVar114[0x1e];
    local_480[0x1f] = (RTCHitN)auVar114[0x1f];
    local_530._8_8_ = 0;
    local_530._0_8_ = *(ulong *)(local_480 + (ulong)uVar145 * 4);
    uVar70 = (ulong)uVar77;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }